

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void interactiveMode(void)

{
  vector<chatra::Script,_std::allocator<chatra::Script>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  byte bVar1;
  element_type *peVar2;
  bool bVar3;
  uint __val;
  string *psVar4;
  _Alloc_hider *p_Var5;
  element_type *this_00;
  pointer pBVar6;
  SpinLock SVar7;
  pointer pPVar8;
  string *psVar9;
  char cVar10;
  char cVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  StepRunResult SVar15;
  undefined4 extraout_var;
  undefined8 *puVar16;
  long *plVar17;
  char *pcVar18;
  size_t sVar19;
  size_type *psVar20;
  size_t sVar21;
  undefined8 uVar22;
  IllegalArgumentException *pIVar23;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar24;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int *piVar25;
  undefined4 extraout_var_02;
  ThreadId TVar26;
  uint uVar27;
  size_t *psVar28;
  string *psVar29;
  ulong uVar30;
  iterator __position;
  ulong uVar31;
  size_type *psVar32;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_00;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_01;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_02;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_03;
  _Alloc_hider _Var33;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RDX;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RDX_00;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pdVar34;
  long lVar35;
  long lVar36;
  pointer pcVar37;
  undefined1 auVar38 [8];
  size_type *psVar39;
  size_t *psVar40;
  ulong uVar41;
  __normal_iterator<const_chatra::debugger::PackageState_*,_std::vector<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>_>
  __it;
  uint uVar42;
  iterator __begin1;
  long lVar43;
  initializer_list<chatra::Script> __l;
  initializer_list<chatra::Script> __l_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  undefined1 local_360 [8];
  tuple<Target,_unsigned_long> e;
  undefined1 local_340 [16];
  IErrorReceiver local_330;
  IErrorReceiverBridge errorReceiver;
  INullErrorReceiver nullErrorReceiver;
  value_type cmd;
  undefined1 local_2e0 [16];
  size_type *local_2d0;
  string lines;
  vector<std::shared_ptr<chatra::Line>,_std::allocator<std::shared_ptr<chatra::Line>_>_> lines_1;
  shared_ptr<chatra::StringTable> sTable;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  string *local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> input;
  pointer local_240;
  undefined1 local_238;
  undefined7 uStack_237;
  size_type sStack_230;
  undefined1 *local_228;
  _Map_pointer local_220;
  undefined1 local_218;
  undefined7 uStack_217;
  _Elt_pointer pbStack_210;
  size_type *local_208;
  string line;
  _Elt_pointer local_1e0;
  undefined1 local_1d8;
  undefined7 uStack_1d7;
  _Elt_pointer pbStack_1d0;
  size_type *local_1c8;
  string subLine;
  vector<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_> packages;
  const_iterator it1;
  int local_17c;
  undefined8 local_178;
  PackageState *local_170;
  undefined1 local_168 [8];
  string fileName;
  string __str;
  string packageName;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  undefined1 local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> verb;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  uint local_68;
  undefined1 local_58 [8];
  string vName;
  bool hasPackageName;
  
  signal(2,signalHandler);
  rl_bind_key(9,rl_insert);
  stifle_history(1000);
  iVar13 = (*(runtime.super___shared_ptr<chatra::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_Runtime[10])();
  interactiveInstanceId = CONCAT44(extraout_var,iVar13);
  dLog(0,"Chatra interactive frontend");
  dLog(0,"type \"!h\" to show debugger command help");
  local_2d0 = &lines._M_string_length;
  lines._M_dataplus._M_p = (pointer)0x0;
  lines._M_string_length._0_1_ = 0;
  local_208 = &line._M_string_length;
  line._M_dataplus._M_p = (pointer)0x0;
  line._M_string_length._0_1_ = 0;
  uVar42 = 1;
  local_178 = (long *)((ulong)local_178._4_4_ << 0x20);
  bVar12 = false;
  __val = 0;
  do {
    if ((prompt(bool,bool,unsigned_int,unsigned_int)::ret_abi_cxx11_ == '\0') &&
       (iVar13 = __cxa_guard_acquire(&prompt(bool,bool,unsigned_int,unsigned_int)::ret_abi_cxx11_),
       iVar13 != 0)) {
      prompt(bool,bool,unsigned_int,unsigned_int)::ret_abi_cxx11_ = &DAT_002486b0;
      _DAT_002486a8 = 0;
      DAT_002486b0 = 0;
      __cxa_atexit(std::__cxx11::string::~string,
                   &prompt(bool,bool,unsigned_int,unsigned_int)::ret_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&prompt(bool,bool,unsigned_int,unsigned_int)::ret_abi_cxx11_);
    }
    if (optEnableColor == '\0') {
      if (bVar12) {
        cVar11 = '\x01';
        if (9 < uVar42) {
          uVar31 = (ulong)uVar42;
          cVar10 = '\x04';
          do {
            cVar11 = cVar10;
            uVar27 = (uint)uVar31;
            if (uVar27 < 100) {
              cVar11 = cVar11 + -2;
              goto LAB_00112ddf;
            }
            if (uVar27 < 1000) {
              cVar11 = cVar11 + -1;
              goto LAB_00112ddf;
            }
            if (uVar27 < 10000) goto LAB_00112ddf;
            uVar31 = uVar31 / 10000;
            cVar10 = cVar11 + '\x04';
          } while (99999 < uVar27);
          cVar11 = cVar11 + '\x01';
        }
LAB_00112ddf:
        local_58 = (undefined1  [8])&vName._M_string_length;
        std::__cxx11::string::_M_construct((ulong)local_58,cVar11);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)local_58,(uint)vName._M_dataplus._M_p,uVar42);
        puVar16 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x1ce58c);
        local_a8 = (undefined1  [8])&verb._M_string_length;
        psVar32 = puVar16 + 2;
        if ((size_type *)*puVar16 == psVar32) {
          verb._M_string_length = *psVar32;
          verb.field_2._M_allocated_capacity = puVar16[3];
        }
        else {
          verb._M_string_length = *psVar32;
          local_a8 = (undefined1  [8])*puVar16;
        }
        verb._M_dataplus._M_p = (pointer)puVar16[1];
        *puVar16 = psVar32;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        plVar17 = (long *)std::__cxx11::string::append(local_a8);
        goto LAB_00112e80;
      }
      if (((ulong)local_178 & 1) == 0) {
        cVar11 = '\x01';
        if (9 < __val) {
          cVar10 = '\x04';
          uVar27 = __val;
          do {
            cVar11 = cVar10;
            if (uVar27 < 100) {
              cVar11 = cVar11 + -2;
              goto LAB_001132d3;
            }
            if (uVar27 < 1000) {
              cVar11 = cVar11 + -1;
              goto LAB_001132d3;
            }
            if (uVar27 < 10000) goto LAB_001132d3;
            bVar3 = 99999 < uVar27;
            cVar10 = cVar11 + '\x04';
            uVar27 = uVar27 / 10000;
          } while (bVar3);
          cVar11 = cVar11 + '\x01';
        }
LAB_001132d3:
        local_168 = (undefined1  [8])&fileName._M_string_length;
        std::__cxx11::string::_M_construct((ulong)local_168,cVar11);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)local_168,(uint)fileName._M_dataplus._M_p,__val);
        plVar17 = (long *)std::__cxx11::string::replace((ulong)local_168,0,(char *)0x0,0x1ce5af);
        __str.field_2._8_8_ = &packageName._M_string_length;
        psVar32 = (size_type *)(plVar17 + 2);
        if ((size_type *)*plVar17 == psVar32) {
          packageName._M_string_length = *psVar32;
          packageName.field_2._M_allocated_capacity = plVar17[3];
        }
        else {
          packageName._M_string_length = *psVar32;
          __str.field_2._8_8_ = (size_type *)*plVar17;
        }
        packageName._M_dataplus._M_p = (pointer)plVar17[1];
        *plVar17 = (long)psVar32;
        plVar17[1] = 0;
        *(undefined1 *)(plVar17 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
        local_58 = (undefined1  [8])&vName._M_string_length;
        psVar32 = puVar16 + 2;
        if ((size_type *)*puVar16 == psVar32) {
          vName._M_string_length = *psVar32;
          vName.field_2._M_allocated_capacity = puVar16[3];
        }
        else {
          vName._M_string_length = *psVar32;
          local_58 = (undefined1  [8])*puVar16;
        }
        vName._M_dataplus._M_p = (pointer)puVar16[1];
        *puVar16 = psVar32;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        cVar11 = '\x01';
        if (9 < uVar42) {
          uVar31 = (ulong)uVar42;
          cVar10 = '\x04';
          do {
            cVar11 = cVar10;
            uVar27 = (uint)uVar31;
            if (uVar27 < 100) {
              cVar11 = cVar11 + -2;
              goto LAB_00113535;
            }
            if (uVar27 < 1000) {
              cVar11 = cVar11 + -1;
              goto LAB_00113535;
            }
            if (uVar27 < 10000) goto LAB_00113535;
            uVar31 = uVar31 / 10000;
            cVar10 = cVar11 + '\x04';
          } while (99999 < uVar27);
          cVar11 = cVar11 + '\x01';
        }
LAB_00113535:
        fileName.field_2._8_8_ = &__str._M_string_length;
        std::__cxx11::string::_M_construct((ulong)((long)&fileName.field_2 + 8),cVar11);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)fileName.field_2._8_8_,(uint)__str._M_dataplus._M_p,uVar42);
        pcVar37 = (pointer)0xf;
        if (local_58 != (undefined1  [8])&vName._M_string_length) {
          pcVar37 = (pointer)vName._M_string_length;
        }
        if (pcVar37 < vName._M_dataplus._M_p +
                      CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p)) {
          pcVar37 = (pointer)0xf;
          if ((size_type *)fileName.field_2._8_8_ != &__str._M_string_length) {
            pcVar37 = (pointer)__str._M_string_length;
          }
          if (pcVar37 < vName._M_dataplus._M_p +
                        CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p))
          goto LAB_001135b6;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)((long)&fileName.field_2 + 8),0,(char *)0x0,(ulong)local_58);
        }
        else {
LAB_001135b6:
          puVar16 = (undefined8 *)std::__cxx11::string::_M_append(local_58,fileName.field_2._8_8_);
        }
        local_a8 = (undefined1  [8])&verb._M_string_length;
        psVar32 = puVar16 + 2;
        if ((size_type *)*puVar16 == psVar32) {
          verb._M_string_length = *psVar32;
          verb.field_2._M_allocated_capacity = puVar16[3];
        }
        else {
          verb._M_string_length = *psVar32;
          local_a8 = (undefined1  [8])*puVar16;
        }
        verb._M_dataplus._M_p = (pointer)puVar16[1];
        *puVar16 = psVar32;
        puVar16[1] = 0;
        *(undefined1 *)psVar32 = 0;
        plVar17 = (long *)std::__cxx11::string::append(local_a8);
      }
      else {
        cVar11 = '\x01';
        if (9 < __val) {
          cVar10 = '\x04';
          uVar27 = __val;
          do {
            cVar11 = cVar10;
            if (uVar27 < 100) {
              cVar11 = cVar11 + -2;
              goto LAB_00113179;
            }
            if (uVar27 < 1000) {
              cVar11 = cVar11 + -1;
              goto LAB_00113179;
            }
            if (uVar27 < 10000) goto LAB_00113179;
            bVar3 = 99999 < uVar27;
            cVar10 = cVar11 + '\x04';
            uVar27 = uVar27 / 10000;
          } while (bVar3);
          cVar11 = cVar11 + '\x01';
        }
LAB_00113179:
        local_168 = (undefined1  [8])&fileName._M_string_length;
        std::__cxx11::string::_M_construct((ulong)local_168,cVar11);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)local_168,(uint)fileName._M_dataplus._M_p,__val);
        plVar17 = (long *)std::__cxx11::string::replace((ulong)local_168,0,(char *)0x0,0x1ce59e);
        __str.field_2._8_8_ = &packageName._M_string_length;
        psVar32 = (size_type *)(plVar17 + 2);
        if ((size_type *)*plVar17 == psVar32) {
          packageName._M_string_length = *psVar32;
          packageName.field_2._M_allocated_capacity = plVar17[3];
        }
        else {
          packageName._M_string_length = *psVar32;
          __str.field_2._8_8_ = (size_type *)*plVar17;
        }
        packageName._M_dataplus._M_p = (pointer)plVar17[1];
        *plVar17 = (long)psVar32;
        plVar17[1] = 0;
        *(undefined1 *)(plVar17 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
        local_58 = (undefined1  [8])&vName._M_string_length;
        psVar32 = puVar16 + 2;
        if ((size_type *)*puVar16 == psVar32) {
          vName._M_string_length = *psVar32;
          vName.field_2._M_allocated_capacity = puVar16[3];
        }
        else {
          vName._M_string_length = *psVar32;
          local_58 = (undefined1  [8])*puVar16;
        }
        vName._M_dataplus._M_p = (pointer)puVar16[1];
        *puVar16 = psVar32;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        cVar11 = '\x01';
        if (9 < uVar42) {
          uVar31 = (ulong)uVar42;
          cVar10 = '\x04';
          do {
            cVar11 = cVar10;
            uVar27 = (uint)uVar31;
            if (uVar27 < 100) {
              cVar11 = cVar11 + -2;
              goto LAB_0011342d;
            }
            if (uVar27 < 1000) {
              cVar11 = cVar11 + -1;
              goto LAB_0011342d;
            }
            if (uVar27 < 10000) goto LAB_0011342d;
            uVar31 = uVar31 / 10000;
            cVar10 = cVar11 + '\x04';
          } while (99999 < uVar27);
          cVar11 = cVar11 + '\x01';
        }
LAB_0011342d:
        fileName.field_2._8_8_ = &__str._M_string_length;
        std::__cxx11::string::_M_construct((ulong)((long)&fileName.field_2 + 8),cVar11);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)fileName.field_2._8_8_,(uint)__str._M_dataplus._M_p,uVar42);
        pcVar37 = (pointer)0xf;
        if (local_58 != (undefined1  [8])&vName._M_string_length) {
          pcVar37 = (pointer)vName._M_string_length;
        }
        if (pcVar37 < vName._M_dataplus._M_p +
                      CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p)) {
          pcVar37 = (pointer)0xf;
          if ((size_type *)fileName.field_2._8_8_ != &__str._M_string_length) {
            pcVar37 = (pointer)__str._M_string_length;
          }
          if (pcVar37 < vName._M_dataplus._M_p +
                        CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p))
          goto LAB_001134ae;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)((long)&fileName.field_2 + 8),0,(char *)0x0,(ulong)local_58);
        }
        else {
LAB_001134ae:
          puVar16 = (undefined8 *)std::__cxx11::string::_M_append(local_58,fileName.field_2._8_8_);
        }
        local_a8 = (undefined1  [8])&verb._M_string_length;
        psVar32 = puVar16 + 2;
        if ((size_type *)*puVar16 == psVar32) {
          verb._M_string_length = *psVar32;
          verb.field_2._M_allocated_capacity = puVar16[3];
        }
        else {
          verb._M_string_length = *psVar32;
          local_a8 = (undefined1  [8])*puVar16;
        }
        verb._M_dataplus._M_p = (pointer)puVar16[1];
        *puVar16 = psVar32;
        puVar16[1] = 0;
        *(undefined1 *)psVar32 = 0;
        plVar17 = (long *)std::__cxx11::string::append(local_a8);
      }
LAB_00113636:
      psVar40 = &args.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_map_size;
      psVar28 = (size_t *)(plVar17 + 2);
      if ((size_t *)*plVar17 == psVar28) {
        args.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_map_size = *psVar28;
        args.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)plVar17[3];
        packageName.field_2._8_8_ = psVar40;
      }
      else {
        args.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_map_size = *psVar28;
        packageName.field_2._8_8_ = (size_t *)*plVar17;
      }
      args.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)plVar17[1];
      *plVar17 = (long)psVar28;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
      std::__cxx11::string::operator=
                ((string *)&prompt(bool,bool,unsigned_int,unsigned_int)::ret_abi_cxx11_,
                 (string *)(packageName.field_2._M_local_buf + 8));
      if ((size_t *)packageName.field_2._8_8_ != psVar40) {
        operator_delete((void *)packageName.field_2._8_8_);
      }
      if (local_a8 != (undefined1  [8])&verb._M_string_length) {
        operator_delete((void *)local_a8);
      }
      if ((size_type *)fileName.field_2._8_8_ != &__str._M_string_length) {
        operator_delete((void *)fileName.field_2._8_8_);
      }
      if (local_58 != (undefined1  [8])&vName._M_string_length) {
        operator_delete((void *)local_58);
      }
      if ((size_type *)__str.field_2._8_8_ != &packageName._M_string_length) {
        operator_delete((void *)__str.field_2._8_8_);
      }
      psVar4 = &fileName;
      auVar38 = local_168;
    }
    else {
      cVar11 = '\x01';
      if (!bVar12) {
        if (9 < __val) {
          cVar10 = '\x04';
          uVar27 = __val;
          do {
            cVar11 = cVar10;
            if (uVar27 < 100) {
              cVar11 = cVar11 + -2;
              goto LAB_00112f1c;
            }
            if (uVar27 < 1000) {
              cVar11 = cVar11 + -1;
              goto LAB_00112f1c;
            }
            if (uVar27 < 10000) goto LAB_00112f1c;
            bVar3 = 99999 < uVar27;
            cVar10 = cVar11 + '\x04';
            uVar27 = uVar27 / 10000;
          } while (bVar3);
          cVar11 = cVar11 + '\x01';
        }
LAB_00112f1c:
        local_168 = (undefined1  [8])&fileName._M_string_length;
        std::__cxx11::string::_M_construct((ulong)local_168,cVar11);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)local_168,(uint)fileName._M_dataplus._M_p,__val);
        plVar17 = (long *)std::__cxx11::string::replace((ulong)local_168,0,(char *)0x0,0x1ce5a4);
        __str.field_2._8_8_ = &packageName._M_string_length;
        psVar32 = (size_type *)(plVar17 + 2);
        if ((size_type *)*plVar17 == psVar32) {
          packageName._M_string_length = *psVar32;
          packageName.field_2._M_allocated_capacity = plVar17[3];
        }
        else {
          packageName._M_string_length = *psVar32;
          __str.field_2._8_8_ = (size_type *)*plVar17;
        }
        packageName._M_dataplus._M_p = (pointer)plVar17[1];
        *plVar17 = (long)psVar32;
        plVar17[1] = 0;
        *(undefined1 *)(plVar17 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
        local_58 = (undefined1  [8])&vName._M_string_length;
        psVar32 = puVar16 + 2;
        if ((size_type *)*puVar16 == psVar32) {
          vName._M_string_length = *psVar32;
          vName.field_2._M_allocated_capacity = puVar16[3];
        }
        else {
          vName._M_string_length = *psVar32;
          local_58 = (undefined1  [8])*puVar16;
        }
        vName._M_dataplus._M_p = (pointer)puVar16[1];
        *puVar16 = psVar32;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        cVar11 = '\x01';
        if (9 < uVar42) {
          uVar31 = (ulong)uVar42;
          cVar10 = '\x04';
          do {
            cVar11 = cVar10;
            uVar27 = (uint)uVar31;
            if (uVar27 < 100) {
              cVar11 = cVar11 + -2;
              goto LAB_00113064;
            }
            if (uVar27 < 1000) {
              cVar11 = cVar11 + -1;
              goto LAB_00113064;
            }
            if (uVar27 < 10000) goto LAB_00113064;
            uVar31 = uVar31 / 10000;
            cVar10 = cVar11 + '\x04';
          } while (99999 < uVar27);
          cVar11 = cVar11 + '\x01';
        }
LAB_00113064:
        fileName.field_2._8_8_ = &__str._M_string_length;
        std::__cxx11::string::_M_construct((ulong)((long)&fileName.field_2 + 8),cVar11);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)fileName.field_2._8_8_,(uint)__str._M_dataplus._M_p,uVar42);
        pcVar37 = (pointer)0xf;
        if (local_58 != (undefined1  [8])&vName._M_string_length) {
          pcVar37 = (pointer)vName._M_string_length;
        }
        if (pcVar37 < vName._M_dataplus._M_p +
                      CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p)) {
          pcVar37 = (pointer)0xf;
          if ((size_type *)fileName.field_2._8_8_ != &__str._M_string_length) {
            pcVar37 = (pointer)__str._M_string_length;
          }
          if (pcVar37 < vName._M_dataplus._M_p +
                        CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p))
          goto LAB_001130e5;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)((long)&fileName.field_2 + 8),0,(char *)0x0,(ulong)local_58);
        }
        else {
LAB_001130e5:
          puVar16 = (undefined8 *)std::__cxx11::string::_M_append(local_58,fileName.field_2._8_8_);
        }
        local_a8 = (undefined1  [8])&verb._M_string_length;
        psVar32 = puVar16 + 2;
        if ((size_type *)*puVar16 == psVar32) {
          verb._M_string_length = *psVar32;
          verb.field_2._M_allocated_capacity = puVar16[3];
        }
        else {
          verb._M_string_length = *psVar32;
          local_a8 = (undefined1  [8])*puVar16;
        }
        verb._M_dataplus._M_p = (pointer)puVar16[1];
        *puVar16 = psVar32;
        puVar16[1] = 0;
        *(undefined1 *)psVar32 = 0;
        plVar17 = (long *)std::__cxx11::string::append(local_a8);
        goto LAB_00113636;
      }
      if (9 < uVar42) {
        uVar31 = (ulong)uVar42;
        cVar10 = '\x04';
        do {
          cVar11 = cVar10;
          uVar27 = (uint)uVar31;
          if (uVar27 < 100) {
            cVar11 = cVar11 + -2;
            goto LAB_00112d37;
          }
          if (uVar27 < 1000) {
            cVar11 = cVar11 + -1;
            goto LAB_00112d37;
          }
          if (uVar27 < 10000) goto LAB_00112d37;
          uVar31 = uVar31 / 10000;
          cVar10 = cVar11 + '\x04';
        } while (99999 < uVar27);
        cVar11 = cVar11 + '\x01';
      }
LAB_00112d37:
      local_58 = (undefined1  [8])&vName._M_string_length;
      std::__cxx11::string::_M_construct((ulong)local_58,cVar11);
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)local_58,(uint)vName._M_dataplus._M_p,uVar42);
      puVar16 = (undefined8 *)std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x1ce592);
      local_a8 = (undefined1  [8])&verb._M_string_length;
      psVar32 = puVar16 + 2;
      if ((size_type *)*puVar16 == psVar32) {
        verb._M_string_length = *psVar32;
        verb.field_2._M_allocated_capacity = puVar16[3];
      }
      else {
        verb._M_string_length = *psVar32;
        local_a8 = (undefined1  [8])*puVar16;
      }
      verb._M_dataplus._M_p = (pointer)puVar16[1];
      *puVar16 = psVar32;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      plVar17 = (long *)std::__cxx11::string::append(local_a8);
LAB_00112e80:
      psVar40 = &args.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_map_size;
      psVar28 = (size_t *)(plVar17 + 2);
      if ((size_t *)*plVar17 == psVar28) {
        args.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_map_size = *psVar28;
        args.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)plVar17[3];
        packageName.field_2._8_8_ = psVar40;
      }
      else {
        args.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_map_size = *psVar28;
        packageName.field_2._8_8_ = (size_t *)*plVar17;
      }
      args.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)plVar17[1];
      *plVar17 = (long)psVar28;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
      std::__cxx11::string::operator=
                ((string *)&prompt(bool,bool,unsigned_int,unsigned_int)::ret_abi_cxx11_,
                 (string *)(packageName.field_2._M_local_buf + 8));
      if ((size_t *)packageName.field_2._8_8_ != psVar40) {
        operator_delete((void *)packageName.field_2._8_8_);
      }
      if (local_a8 != (undefined1  [8])&verb._M_string_length) {
        operator_delete((void *)local_a8);
      }
      psVar4 = &vName;
      auVar38 = local_58;
    }
    if (auVar38 != (undefined1  [8])&psVar4->_M_string_length) {
      operator_delete((void *)auVar38);
    }
    pcVar18 = (char *)readline(prompt(bool,bool,unsigned_int,unsigned_int)::ret_abi_cxx11_);
    sVar19 = strlen(pcVar18);
    if (sVar19 == 0) {
      iVar13 = 2;
    }
    else {
      iVar13 = 0;
      uVar31 = 0;
      do {
        if (pcVar18[uVar31] == '\t') {
          iVar13 = iVar13 + 1;
        }
        else if (((pcVar18[uVar31] == ' ' && uVar31 + 3 < sVar19) && (pcVar18[uVar31 + 1] == ' '))
                && (pcVar18[uVar31 + 2] == ' ')) {
          lVar35 = uVar31 + 3;
          uVar41 = uVar31 + 3;
          if (pcVar18[lVar35] != ' ') {
            uVar41 = uVar31;
          }
          uVar31 = uVar41;
          iVar13 = iVar13 + (uint)(pcVar18[lVar35] == ' ');
        }
        uVar31 = uVar31 + 1;
      } while (uVar31 < sVar19);
      iVar13 = iVar13 + 2;
    }
    local_1c8 = &subLine._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,pcVar18,pcVar18 + sVar19);
    psVar40 = &args.
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_map_size;
    if ((bool)(bVar12 & iVar13 != 0)) {
      do {
        std::__cxx11::string::_M_replace_aux((ulong)&local_1c8,0,0,'\x01');
        iVar13 = iVar13 + -1;
      } while (iVar13 != 0);
    }
    psVar32 = local_1c8;
    if (0 < (long)subLine._M_dataplus._M_p >> 2) {
      lVar35 = ((long)subLine._M_dataplus._M_p >> 2) + 1;
      psVar39 = (size_type *)((long)local_1c8 + 3);
      do {
        psVar32 = psVar39;
        if ((0x20 < (ulong)*(byte *)((long)psVar32 + -3)) ||
           ((0x100000600U >> ((ulong)*(byte *)((long)psVar32 + -3) & 0x3f) & 1) == 0)) {
          psVar32 = (size_type *)((long)psVar32 + -3);
          goto LAB_00113929;
        }
        if ((0x20 < (ulong)*(byte *)((long)psVar32 + -2)) ||
           ((0x100000600U >> ((ulong)*(byte *)((long)psVar32 + -2) & 0x3f) & 1) == 0)) {
          psVar32 = (size_type *)((long)psVar32 + -2);
          goto LAB_00113929;
        }
        if ((0x20 < (ulong)*(byte *)((long)psVar32 + -1)) ||
           ((0x100000600U >> ((ulong)*(byte *)((long)psVar32 + -1) & 0x3f) & 1) == 0)) {
          psVar32 = (size_type *)((long)psVar32 + -1);
          goto LAB_00113929;
        }
        if ((0x20 < (ulong)(byte)*psVar32) ||
           ((0x100000600U >> ((ulong)(byte)*psVar32 & 0x3f) & 1) == 0)) goto LAB_00113929;
        lVar35 = lVar35 + -1;
        psVar39 = (size_type *)((long)psVar32 + 4);
        psVar32 = (size_type *)
                  (((ulong)subLine._M_dataplus._M_p & 0xfffffffffffffffc) + (long)local_1c8);
      } while (1 < lVar35);
    }
    lVar35 = ((long)local_1c8 + (long)subLine._M_dataplus._M_p) - (long)psVar32;
    if (lVar35 == 1) {
LAB_001138fc:
      if ((0x20 < (ulong)(byte)*psVar32) ||
         ((0x100000600U >> ((ulong)(byte)*psVar32 & 0x3f) & 1) == 0)) goto LAB_00113929;
    }
    else {
      if (lVar35 == 2) {
LAB_001138e0:
        if (((ulong)(byte)*psVar32 < 0x21) &&
           ((0x100000600U >> ((ulong)(byte)*psVar32 & 0x3f) & 1) != 0)) {
          psVar32 = (size_type *)((long)psVar32 + 1);
          goto LAB_001138fc;
        }
      }
      else {
        if (lVar35 != 3) goto LAB_0011393a;
        if (((ulong)(byte)*psVar32 < 0x21) &&
           ((0x100000600U >> ((ulong)(byte)*psVar32 & 0x3f) & 1) != 0)) {
          psVar32 = (size_type *)((long)psVar32 + 1);
          goto LAB_001138e0;
        }
      }
LAB_00113929:
      if ((size_type *)((long)local_1c8 + (long)subLine._M_dataplus._M_p) != psVar32) {
        add_history();
      }
    }
LAB_0011393a:
    if ((subLine._M_dataplus._M_p == (pointer)0x0) ||
       (((byte *)((long)local_1c8 + -1))[(long)subLine._M_dataplus._M_p] != 10)) {
      std::__cxx11::string::push_back((char)&local_1c8);
    }
    uVar42 = uVar42 + 1;
    if ((subLine._M_dataplus._M_p < (pointer)0x2) ||
       (((byte *)((long)local_1c8 + -2))[(long)subLine._M_dataplus._M_p] != 0x5c)) {
      std::__cxx11::string::_M_append((char *)&local_208,(ulong)local_1c8);
      while (uVar31 = std::__cxx11::string::find((char *)&local_208,0x1ce4d1,0),
            uVar31 != 0xffffffffffffffff) {
        std::__cxx11::string::erase((ulong)&local_208,uVar31);
      }
      std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_208);
      if (((ulong)local_178 & 1) == 0) {
        psVar32 = (size_type *)((long)local_208 + (long)line._M_dataplus._M_p);
        psVar39 = local_208;
        if (0 < (long)line._M_dataplus._M_p >> 2) {
          psVar39 = (size_type *)
                    (((ulong)line._M_dataplus._M_p & 0xfffffffffffffffc) + (long)local_208);
          lVar35 = ((long)line._M_dataplus._M_p >> 2) + 1;
          psVar20 = (size_type *)((long)local_208 + 3);
          do {
            if ((*(char *)((long)psVar20 + -3) != ' ') && (*(char *)((long)psVar20 + -3) != '\t')) {
              psVar20 = (size_type *)((long)psVar20 + -3);
              goto LAB_00113cc9;
            }
            if ((*(char *)((long)psVar20 + -2) != ' ') && (*(char *)((long)psVar20 + -2) != '\t')) {
              psVar20 = (size_type *)((long)psVar20 + -2);
              goto LAB_00113cc9;
            }
            if ((*(char *)((long)psVar20 + -1) != ' ') && (*(char *)((long)psVar20 + -1) != '\t')) {
              psVar20 = (size_type *)((long)psVar20 + -1);
              goto LAB_00113cc9;
            }
            if (((char)*psVar20 != ' ') && ((char)*psVar20 != '\t')) goto LAB_00113cc9;
            lVar35 = lVar35 + -1;
            psVar20 = (size_type *)((long)psVar20 + 4);
          } while (1 < lVar35);
        }
        lVar35 = (long)psVar32 - (long)psVar39;
        if (lVar35 == 1) {
LAB_00113bc0:
          psVar20 = psVar39;
          if ((char)*psVar39 == '\t') {
            psVar20 = psVar32;
          }
          if ((char)*psVar39 == ' ') {
            psVar20 = psVar32;
          }
        }
        else if (lVar35 == 2) {
LAB_00113bb0:
          if (((char)*psVar39 == ' ') || (psVar20 = psVar39, (char)*psVar39 == '\t')) {
            psVar39 = (size_type *)((long)psVar39 + 1);
            goto LAB_00113bc0;
          }
        }
        else {
          psVar20 = psVar32;
          if ((lVar35 == 3) &&
             (((char)*psVar39 == ' ' || (psVar20 = psVar39, (char)*psVar39 == '\t')))) {
            psVar39 = (size_type *)((long)psVar39 + 1);
            goto LAB_00113bb0;
          }
        }
LAB_00113cc9:
        packageName.field_2._8_8_ = psVar40;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)((long)&packageName.field_2 + 8),psVar20);
        uVar22 = packageName.field_2._8_8_;
        bVar12 = isBlockStatement((string *)packageName.field_2._8_8_);
        if ((size_t *)uVar22 != psVar40) {
          operator_delete((void *)uVar22);
        }
        if (bVar12) goto LAB_00113d15;
LAB_00113a52:
        psVar40 = &args.
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_map_size;
        line._M_dataplus._M_p = (pointer)0x0;
        *(char *)local_208 = '\0';
        if (0 < (long)lines._M_dataplus._M_p >> 2) {
          lVar35 = ((long)lines._M_dataplus._M_p >> 2) + 1;
          pcVar18 = (char *)((long)local_2d0 + 3);
          do {
            if (((((pcVar18[-3] != ' ') && (pcVar18[-3] != '\t')) ||
                 ((pcVar18[-2] != ' ' && (pcVar18[-2] != '\t')))) ||
                ((pcVar18[-1] != ' ' && (pcVar18[-1] != '\t')))) ||
               ((*pcVar18 != ' ' && (*pcVar18 != '\t')))) break;
            lVar35 = lVar35 + -1;
            pcVar18 = pcVar18 + 4;
          } while (1 < lVar35);
        }
        std::__cxx11::string::substr((ulong)&local_268,(ulong)&local_2d0);
        lines._M_dataplus._M_p = (pointer)0x0;
        *(char *)local_2d0 = '\0';
        psVar4 = (string *)((long)&(local_268->_M_dataplus)._M_p + (long)input._M_dataplus._M_p);
        psVar29 = local_268;
        if (0 < (long)input._M_dataplus._M_p >> 2) {
          lVar35 = ((long)input._M_dataplus._M_p >> 2) + 1;
          psVar9 = (string *)((long)&(local_268->_M_dataplus)._M_p + 3);
          do {
            psVar29 = psVar9;
            if ((0x20 < (ulong)(byte)psVar29[-1].field_2._M_local_buf[0xd]) ||
               ((0x100000600U >> ((ulong)(byte)psVar29[-1].field_2._M_local_buf[0xd] & 0x3f) & 1) ==
                0)) {
              psVar29 = (string *)((long)&psVar29[-1].field_2 + 0xd);
              goto LAB_00113ea4;
            }
            if ((0x20 < (ulong)(byte)psVar29[-1].field_2._M_local_buf[0xe]) ||
               ((0x100000600U >> ((ulong)(byte)psVar29[-1].field_2._M_local_buf[0xe] & 0x3f) & 1) ==
                0)) {
              psVar29 = (string *)((long)&psVar29[-1].field_2 + 0xe);
              goto LAB_00113ea4;
            }
            if ((0x20 < (ulong)(byte)psVar29[-1].field_2._M_local_buf[0xf]) ||
               ((0x100000600U >> ((ulong)(byte)psVar29[-1].field_2._M_local_buf[0xf] & 0x3f) & 1) ==
                0)) {
              psVar29 = (string *)((long)&psVar29[-1].field_2 + 0xf);
              goto LAB_00113ea4;
            }
            uVar31 = (ulong)*(byte *)&(psVar29->_M_dataplus)._M_p;
            if ((0x20 < uVar31) || ((0x100000600U >> (uVar31 & 0x3f) & 1) == 0)) goto LAB_00113ea4;
            lVar35 = lVar35 + -1;
            p_Var5 = &psVar29->_M_dataplus;
            psVar29 = (string *)
                      ((long)&(local_268->_M_dataplus)._M_p +
                      ((ulong)input._M_dataplus._M_p & 0xfffffffffffffffc));
            psVar9 = (string *)((long)&p_Var5->_M_p + 4);
          } while (1 < lVar35);
        }
        lVar35 = (long)psVar4 - (long)psVar29;
        if (lVar35 == 1) {
LAB_00113e73:
          uVar31 = (ulong)*(byte *)&(psVar29->_M_dataplus)._M_p;
          if ((0x20 < uVar31) || ((0x100000600U >> (uVar31 & 0x3f) & 1) == 0)) goto LAB_00113ea4;
        }
        else {
          if (lVar35 == 2) {
LAB_00113e57:
            uVar31 = (ulong)*(byte *)&(psVar29->_M_dataplus)._M_p;
            if ((uVar31 < 0x21) && ((0x100000600U >> (uVar31 & 0x3f) & 1) != 0)) {
              psVar29 = (string *)((long)&(psVar29->_M_dataplus)._M_p + 1);
              goto LAB_00113e73;
            }
          }
          else {
            if (lVar35 != 3) goto LAB_00114a06;
            uVar31 = (ulong)*(byte *)&(psVar29->_M_dataplus)._M_p;
            if ((uVar31 < 0x21) && ((0x100000600U >> (uVar31 & 0x3f) & 1) != 0)) {
              psVar29 = (string *)((long)&(psVar29->_M_dataplus)._M_p + 1);
              goto LAB_00113e57;
            }
          }
LAB_00113ea4:
          if (psVar4 != psVar29) {
            if (*(char *)&(local_268->_M_dataplus)._M_p == '!') {
              chatra::StringTable::newInstance();
              errorReceiver._16_8_ = &PTR__IErrorReceiver_00243198;
              local_330._vptr_IErrorReceiver = (_func_int **)&PTR__IErrorReceiver_002431e8;
              errorReceiver.super_IErrorReceiver._vptr_IErrorReceiver =
                   (_func_int **)&errorReceiver.errorCount;
              errorReceiver.target._0_4_ = 0;
              packageName.field_2._8_8_ = psVar40;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)((long)&packageName.field_2 + 8),"(debugger-command)","");
              fileName.field_2._8_8_ = &__str._M_string_length;
              psVar4 = (string *)((long)&fileName.field_2 + 8);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)psVar4,local_268,input._M_dataplus._M_p + (long)local_268);
              chatra::parseLines((vector<std::shared_ptr<chatra::Line>,_std::allocator<std::shared_ptr<chatra::Line>_>_>
                                  *)((long)&lines.field_2 + 8),&local_330,
                                 (shared_ptr<chatra::StringTable> *)
                                 &lines_1.
                                  super__Vector_base<std::shared_ptr<chatra::Line>,_std::allocator<std::shared_ptr<chatra::Line>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (string *)((long)&packageName.field_2 + 8),1,psVar4);
              if ((size_type *)fileName.field_2._8_8_ != &__str._M_string_length) {
                operator_delete((void *)fileName.field_2._8_8_);
              }
              if ((size_t *)packageName.field_2._8_8_ != psVar40) {
                operator_delete((void *)packageName.field_2._8_8_);
              }
              if (((((int)errorReceiver.target == 0) &&
                   ((pointer)lines.field_2._8_8_ !=
                    lines_1.
                    super__Vector_base<std::shared_ptr<chatra::Line>,_std::allocator<std::shared_ptr<chatra::Line>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)) &&
                  (lVar35 = *(long *)(*(long *)lines.field_2._8_8_ + 0x58),
                  1 < (ulong)((*(long *)(*(long *)lines.field_2._8_8_ + 0x60) - lVar35 >> 4) *
                             -0x3333333333333333))) && (*(int *)(lVar35 + 0x78) == 1)) {
                args.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
                args.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
                args.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
                args.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
                args.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
                args.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
                args.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_map_size = 0;
                args.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
                packageName.field_2._8_8_ = 0;
                args.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
                std::
                _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::_M_initialize_map((_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)((long)&packageName.field_2 + 8),0);
                local_170 = (PackageState *)
                            lines_1.
                            super__Vector_base<std::shared_ptr<chatra::Line>,_std::allocator<std::shared_ptr<chatra::Line>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                uVar22 = lines.field_2._8_8_;
                if ((pointer)lines.field_2._8_8_ !=
                    lines_1.
                    super__Vector_base<std::shared_ptr<chatra::Line>,_std::allocator<std::shared_ptr<chatra::Line>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  do {
                    lVar36 = *(long *)(*(long *)uVar22 + 0x60);
                    local_178 = (long *)uVar22;
                    for (lVar35 = *(long *)(*(long *)uVar22 + 0x58); lVar35 != lVar36;
                        lVar35 = lVar35 + 0x50) {
                      if (*(int *)(lVar35 + 0x28) == 2) {
                        if ((**(char **)(lVar35 + 0x30) != '\"') &&
                           (**(char **)(lVar35 + 0x30) != '\'')) {
                          pIVar23 = (IllegalArgumentException *)__cxa_allocate_exception(0x28);
                          chatra::IllegalArgumentException::IllegalArgumentException
                                    (pIVar23,
                                     "string quotation pattern used with specified parameter is not supported"
                                    );
                          __cxa_throw(pIVar23,&chatra::IllegalArgumentException::typeinfo,
                                      chatra::NativeException::~NativeException);
                        }
                        local_a8 = (undefined1  [8])&verb._M_string_length;
                        verb._M_dataplus._M_p = (pointer)0x0;
                        verb._M_string_length = verb._M_string_length & 0xffffffffffffff00;
                        uVar31 = *(ulong *)(lVar35 + 0x38);
                        if (1 < uVar31) {
                          uVar41 = 1;
                          do {
                            bVar1 = *(byte *)(*(long *)(lVar35 + 0x30) + uVar41);
                            uVar30 = *(long *)(lVar35 + 0x30) + uVar41;
                            if (bVar1 == 0x5c) {
                              uVar42 = *(byte *)(uVar30 + 1) - 0x22;
                              if ((0x3a < uVar42) ||
                                 ((0x400000000000021U >> ((ulong)uVar42 & 0x3f) & 1) == 0)) {
                                pIVar23 = (IllegalArgumentException *)__cxa_allocate_exception(0x28)
                                ;
                                chatra::IllegalArgumentException::IllegalArgumentException
                                          (pIVar23,"unknown escape sequence");
                                __cxa_throw(pIVar23,&chatra::IllegalArgumentException::typeinfo,
                                            chatra::NativeException::~NativeException);
                              }
                              std::__cxx11::string::_M_replace_aux
                                        ((ulong)local_a8,(ulong)verb._M_dataplus._M_p,0,'\x01');
                              uVar41 = uVar41 + 2;
                            }
                            else {
                              lVar43 = 1;
                              if ((char)bVar1 < '\0') {
                                lVar43 = 2;
                                if (((bVar1 & 0xe0) != 0xc0) && (lVar43 = 3, (bVar1 & 0xf0) != 0xe0)
                                   ) {
                                  lVar43 = (ulong)((bVar1 & 0xf8) == 0xf0) << 2;
                                }
                                if ((uVar31 < lVar43 + uVar41) || (1 < (uint)lVar43)) {
                                  lVar43 = 0;
                                }
                              }
                              std::__cxx11::string::replace
                                        ((ulong)local_a8,(ulong)verb._M_dataplus._M_p,(char *)0x0,
                                         uVar30);
                              uVar41 = uVar41 + lVar43;
                            }
                            uVar31 = *(ulong *)(lVar35 + 0x38);
                          } while (uVar41 < uVar31);
                        }
                        std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                        emplace_back<std::__cxx11::string>
                                  ((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)((long)&packageName.field_2 + 8),
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_a8);
LAB_00114344:
                        if (local_a8 != (undefined1  [8])&verb._M_string_length) {
                          operator_delete((void *)local_a8);
                        }
                      }
                      else {
                        if (*(int *)(lVar35 + 0x28) != 0) {
                          peVar2 = lines_1.
                                   super__Vector_base<std::shared_ptr<chatra::Line>,_std::allocator<std::shared_ptr<chatra::Line>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage[4].
                                   super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr;
                          local_a8 = (undefined1  [8])&verb._M_string_length;
                          lVar43 = *(long *)(&peVar2->containsError +
                                            (ulong)*(uint *)(lVar35 + 0x2c) * 0x20);
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)local_a8,lVar43,
                                     (&peVar2->fileName)[*(uint *)(lVar35 + 0x2c)]._M_dataplus._M_p
                                     + lVar43);
                          std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                          emplace_back<std::__cxx11::string>
                                    ((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)((long)&packageName.field_2 + 8),
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_a8);
                          goto LAB_00114344;
                        }
                        std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                        emplace_back<std::__cxx11::string&>
                                  ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                    *)(packageName.field_2._M_local_buf + 8),
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(lVar35 + 0x30));
                      }
                    }
                    uVar22 = local_178 + 2;
                  } while ((PackageState *)uVar22 != local_170);
                }
                pdVar34 = (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(&packageName.field_2._M_allocated_capacity + 1);
                std::
                deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::pop_front(pdVar34);
                nullErrorReceiver.super_IErrorReceiver._vptr_IErrorReceiver =
                     (IErrorReceiver)&cmd._M_string_length;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&nullErrorReceiver,
                           *(long *)args.
                                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Deque_impl_data._M_map_size,
                           *(long *)(args.
                                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Deque_impl_data._M_map_size + 8) +
                           *(long *)args.
                                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Deque_impl_data._M_map_size);
                std::
                deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::pop_front(pdVar34);
                iVar13 = std::__cxx11::string::compare((char *)&nullErrorReceiver);
                if ((iVar13 == 0) ||
                   (iVar13 = std::__cxx11::string::compare((char *)&nullErrorReceiver), iVar13 == 0)
                   ) {
                  dLog(0,"debugger command:");
                  lVar35 = 0x10;
                  do {
                    dLogC(1,"^!$%s %s",
                          *(undefined8 *)((long)&PTR_anon_var_dwarf_27a4d_00242e90 + lVar35),
                          *(undefined8 *)(&UNK_00242e98 + lVar35));
                    dLog(2,"%s",*(undefined8 *)((long)&PTR_anon_var_dwarf_27d10_00242ea0 + lVar35));
                    lVar35 = lVar35 + 0x18;
                  } while (lVar35 != 400);
                  goto LAB_00114ab0;
                }
                iVar13 = std::__cxx11::string::compare((char *)&nullErrorReceiver);
                if (iVar13 == 0) {
                  local_58 = (undefined1  [8])&vName._M_string_length;
                  vName._M_dataplus._M_p = (pointer)0x0;
                  vName._M_string_length = vName._M_string_length & 0xffffffffffffff00;
                  if (1 < ((long)((long)args.
                                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Deque_impl_data._M_start._M_first -
                                 args.
                                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Deque_impl_data._M_map_size) >> 5) +
                          ((long)args.
                                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Deque_impl_data._M_start._M_node -
                           (long)args.
                                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Deque_impl_data._M_finish._M_cur >> 5) +
                          ((((ulong)((long)args.
                                           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Deque_impl_data._M_finish._M_last -
                                    (long)args.
                                          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Deque_impl_data._M_start._M_last) >> 3) -
                           1) + (ulong)(args.
                                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Deque_impl_data._M_finish._M_last ==
                                       (_Elt_pointer)0x0)) * 0x10) {
                    lVar35 = (long)(args.
                                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Deque_impl_data._M_map_size -
                                   (long)args.
                                         super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 5;
                    uVar31 = lVar35 + 1;
                    if (lVar35 < -1) {
                      uVar41 = (long)uVar31 >> 4;
LAB_00114bfb:
                      pcVar18 = (&(args.
                                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Deque_impl_data._M_start._M_last)->_M_dataplus)
                                [uVar41]._M_p + (uVar31 + uVar41 * -0x10) * 0x20;
                    }
                    else {
                      if (0xf < uVar31) {
                        uVar41 = uVar31 >> 4;
                        goto LAB_00114bfb;
                      }
                      pcVar18 = (char *)(args.
                                         super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Deque_impl_data._M_map_size + 0x20);
                    }
                    iVar13 = std::__cxx11::string::compare(pcVar18);
                    if (iVar13 == 0) {
                      std::__cxx11::string::_M_assign((string *)local_58);
                      std::
                      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::pop_front(pdVar34);
                      std::
                      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::pop_front(pdVar34);
                    }
                  }
                  __return_storage_ptr__ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&__str.field_2 + 8);
                  consume<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                            (__return_storage_ptr__,
                             (string *)nullErrorReceiver.super_IErrorReceiver._vptr_IErrorReceiver,
                             (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)((long)&packageName.field_2 + 8));
                  input.field_2._8_8_ = &local_238;
                  pbVar24 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_58;
                  if (vName._M_dataplus._M_p == (pointer)0x0) {
                    pbVar24 = __return_storage_ptr__;
                  }
                  pcVar37 = (pbVar24->_M_dataplus)._M_p;
                  _Var33 = vName._M_dataplus;
                  if (vName._M_dataplus._M_p == (pointer)0x0) {
                    _Var33 = packageName._M_dataplus;
                  }
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)((long)&input.field_2 + 8),pcVar37,
                             _Var33._M_p + (long)pcVar37);
                  loadScript_abi_cxx11_
                            ((string *)
                             &sTable.
                              super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount,(char *)__str.field_2._8_8_);
                  local_a8 = (undefined1  [8])&verb._M_string_length;
                  if ((undefined1 *)input.field_2._8_8_ == &local_238) {
                    verb.field_2._M_allocated_capacity = sStack_230;
                  }
                  else {
                    local_a8 = (undefined1  [8])input.field_2._8_8_;
                  }
                  verb._M_string_length = CONCAT71(uStack_237,local_238);
                  verb._M_dataplus._M_p = local_240;
                  local_240 = (pointer)0x0;
                  local_238 = 0;
                  verb.field_2._8_8_ = &local_78;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)sTable.super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi == &local_278) {
                    local_78._8_8_ = local_278._8_8_;
                  }
                  else {
                    verb.field_2._8_8_ =
                         sTable.super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
                  }
                  local_78._M_allocated_capacity._1_7_ = local_278._M_allocated_capacity._1_7_;
                  local_78._M_local_buf[0] = local_278._M_local_buf[0];
                  local_278._M_local_buf[0] = '\0';
                  __l_00._M_len = 1;
                  __l_00._M_array = (iterator)local_a8;
                  sTable.super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_278;
                  input.field_2._8_8_ = &local_238;
                  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::vector
                            ((vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_168,
                             __l_00,(allocator_type *)
                                    &packages.
                                     super__Vector_base<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)verb.field_2._8_8_ != &local_78) {
                    operator_delete((void *)verb.field_2._8_8_);
                  }
                  if (local_a8 != (undefined1  [8])&verb._M_string_length) {
                    operator_delete((void *)local_a8);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)sTable.super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi != &local_278) {
                    operator_delete(sTable.
                                    super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi);
                  }
                  if ((undefined1 *)input.field_2._8_8_ != &local_238) {
                    operator_delete((void *)input.field_2._8_8_);
                  }
                  verb._M_dataplus._M_p = (pointer)0x0;
                  verb._M_string_length = verb._M_string_length & 0xffffffffffffff00;
                  local_a8 = (undefined1  [8])&verb._M_string_length;
                  Host::push(host.super___shared_ptr<Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                             (string *)local_a8,
                             (vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_168);
                  if (local_a8 != (undefined1  [8])&verb._M_string_length) {
                    operator_delete((void *)local_a8);
                  }
                  iVar13 = (*(runtime.
                              super___shared_ptr<chatra::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                             )->_vptr_Runtime[7])
                                     (runtime.
                                      super___shared_ptr<chatra::Runtime,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr,local_168);
                  iVar14 = (*(runtime.
                              super___shared_ptr<chatra::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                             )->_vptr_Runtime[9])
                                     (runtime.
                                      super___shared_ptr<chatra::Runtime,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr,CONCAT44(extraout_var_00,iVar13));
                  _Var33 = vName._M_dataplus;
                  pcVar18 = "~file:$";
                  if (vName._M_dataplus._M_p != (pointer)0x0) {
                    cmd.field_2._8_8_ = local_2e0;
                    psVar4 = (string *)(cmd.field_2._M_local_buf + 8);
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)psVar4,local_58,(long)local_58 + vName._M_dataplus._M_p);
                    std::__cxx11::string::append((char *)psVar4);
                    escape((string *)
                           &e.super__Tuple_impl<0UL,_Target,_unsigned_long>.
                            super__Head_base<0UL,_Target,_false>,psVar4);
                    pcVar18 = (char *)e.super__Tuple_impl<0UL,_Target,_unsigned_long>._8_8_;
                  }
                  escape((string *)local_a8,(string *)((long)&__str.field_2 + 8));
                  dLogC(0,"\\[<I%zu>\\] <P%zu> %s %s",CONCAT44(extraout_var_01,iVar14),
                        CONCAT44(extraout_var_00,iVar13),pcVar18,local_a8);
                  if (local_a8 != (undefined1  [8])&verb._M_string_length) {
                    operator_delete((void *)local_a8);
                  }
                  if (_Var33._M_p != (pointer)0x0) {
                    if ((undefined1 *)e.super__Tuple_impl<0UL,_Target,_unsigned_long>._8_8_ !=
                        local_340) {
                      operator_delete((void *)e.super__Tuple_impl<0UL,_Target,_unsigned_long>._8_8_)
                      ;
                    }
                    if ((undefined1 *)cmd.field_2._8_8_ != local_2e0) {
                      operator_delete((void *)cmd.field_2._8_8_);
                    }
                  }
                  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::~vector
                            ((vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_168);
                  if ((size_type *)__str.field_2._8_8_ != &packageName._M_string_length) {
                    operator_delete((void *)__str.field_2._8_8_);
                  }
                  psVar4 = &vName;
                  auVar38 = local_58;
LAB_00114f53:
                  if (auVar38 != (undefined1  [8])&psVar4->_M_string_length) {
                    operator_delete((void *)auVar38);
                  }
                }
                else {
                  iVar13 = std::__cxx11::string::compare((char *)&nullErrorReceiver);
                  if (iVar13 == 0) {
                    LOCK();
                    interruptionState._M_i = Acceptable;
                    UNLOCK();
                    runUntilBreak();
LAB_00114bc9:
                    LOCK();
                    interruptionState._M_i = Masked;
                    UNLOCK();
                  }
                  else {
                    iVar13 = std::__cxx11::string::compare((char *)&nullErrorReceiver);
                    if ((((iVar13 != 0) &&
                         (iVar13 = std::__cxx11::string::compare((char *)&nullErrorReceiver),
                         iVar13 != 0)) &&
                        (iVar13 = std::__cxx11::string::compare((char *)&nullErrorReceiver),
                        iVar13 != 0)) &&
                       ((iVar13 = std::__cxx11::string::compare((char *)&nullErrorReceiver),
                        iVar13 != 0 &&
                        (iVar13 = std::__cxx11::string::compare((char *)&nullErrorReceiver),
                        iVar13 != 0)))) {
                      iVar13 = std::__cxx11::string::compare((char *)&nullErrorReceiver);
                      if ((iVar13 == 0) ||
                         ((iVar13 = std::__cxx11::string::compare((char *)&nullErrorReceiver),
                          iVar13 == 0 ||
                          (iVar13 = std::__cxx11::string::compare((char *)&nullErrorReceiver),
                          iVar13 == 0)))) {
                        if ((args.
                             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_node ==
                             (_Map_pointer)
                             args.
                             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Deque_impl_data._M_map_size) ||
                           (iVar13 = std::__cxx11::string::compare
                                               ((char *)args.
                                                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Deque_impl_data._M_map_size),
                           iVar13 != 0)) {
                          puVar16 = (undefined8 *)__cxa_allocate_exception(0x28);
                          puVar16[2] = 0;
                          puVar16[3] = 0;
                          puVar16[4] = 0;
                          puVar16[1] = puVar16 + 3;
                          *puVar16 = &PTR__NativeException_00242de8;
                          __cxa_throw(puVar16,&chatra::IllegalArgumentException::typeinfo,
                                      chatra::NativeException::~NativeException);
                        }
                        std::
                        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::pop_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)((long)&packageName.field_2 + 8));
                        __str.field_2._8_8_ = &packageName._M_string_length;
                        packageName._M_dataplus._M_p = (pointer)0x0;
                        packageName._M_string_length =
                             packageName._M_string_length & 0xffffffffffffff00;
                        if (args.
                            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_node ==
                            (_Map_pointer)
                            args.
                            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Deque_impl_data._M_map_size) {
LAB_00115031:
                          if (1 < ((long)((long)args.
                                                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Deque_impl_data._M_start._M_first -
                                         args.
                                         super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Deque_impl_data._M_map_size) >> 5) +
                                  ((((ulong)((long)args.
                                                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Deque_impl_data._M_finish._M_last
                                            - (long)args.
                                                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_last)
                                    >> 3) - 1) +
                                  (ulong)(args.
                                          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Deque_impl_data._M_finish._M_last ==
                                         (_Elt_pointer)0x0)) * 0x10 +
                                  ((long)args.
                                         super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Deque_impl_data._M_start._M_node -
                                   (long)args.
                                         super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Deque_impl_data._M_finish._M_cur >> 5)) {
                            lVar35 = (long)(args.
                                            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Deque_impl_data._M_map_size -
                                           (long)args.
                                                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Deque_impl_data._M_start._M_cur) >>
                                     5;
                            uVar31 = lVar35 + 1;
                            if (lVar35 < -1) {
                              uVar41 = (long)uVar31 >> 4;
LAB_001151f6:
                              pcVar18 = (&(args.
                                           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Deque_impl_data._M_start._M_last)->
                                          _M_dataplus)[uVar41]._M_p +
                                        (uVar31 + uVar41 * -0x10) * 0x20;
                            }
                            else {
                              if (0xf < uVar31) {
                                uVar41 = uVar31 >> 4;
                                goto LAB_001151f6;
                              }
                              pcVar18 = (char *)(args.
                                                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Deque_impl_data._M_map_size + 0x20)
                              ;
                            }
                            iVar13 = std::__cxx11::string::compare(pcVar18);
                            if (iVar13 == 0) {
                              vName.field_2._M_local_buf[0xf] = '\x01';
                              std::__cxx11::string::_M_assign
                                        ((string *)(__str.field_2._M_local_buf + 8));
                              std::
                              deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::pop_front(pdVar34);
                              std::
                              deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::pop_front(pdVar34);
                            }
                          }
                        }
                        else {
                          uVar31 = (long)(args.
                                          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Deque_impl_data._M_map_size -
                                         (long)args.
                                               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 5
                          ;
                          if ((long)uVar31 < 0) {
                            uVar41 = (long)(args.
                                            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Deque_impl_data._M_map_size -
                                           (long)args.
                                                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Deque_impl_data._M_start._M_cur) >>
                                     9;
LAB_00114ffa:
                            pcVar18 = (&(args.
                                         super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Deque_impl_data._M_start._M_last)->
                                        _M_dataplus)[uVar41]._M_p + (uVar31 + uVar41 * -0x10) * 0x20
                            ;
                          }
                          else {
                            pcVar18 = (char *)args.
                                              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Deque_impl_data._M_map_size;
                            if (0xf < uVar31) {
                              uVar41 = uVar31 >> 4;
                              goto LAB_00114ffa;
                            }
                          }
                          iVar13 = std::__cxx11::string::compare(pcVar18);
                          if (iVar13 != 0) goto LAB_00115031;
                          vName.field_2._M_local_buf[0xf] = '\x01';
                        }
                        if (((long)((long)args.
                                          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Deque_impl_data._M_start._M_first -
                                   args.
                                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Deque_impl_data._M_map_size) >> 5) +
                            ((long)args.
                                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Deque_impl_data._M_start._M_node -
                             (long)args.
                                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Deque_impl_data._M_finish._M_cur >> 5) +
                            ((((ulong)((long)args.
                                             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Deque_impl_data._M_finish._M_last -
                                      (long)args.
                                            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Deque_impl_data._M_start._M_last) >> 3)
                             - 1) + (ulong)(args.
                                            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Deque_impl_data._M_finish._M_last ==
                                           (_Elt_pointer)0x0)) * 0x10 < 4) goto LAB_00115ebc;
                        lVar35 = (long)(args.
                                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Deque_impl_data._M_map_size -
                                       (long)args.
                                             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 5;
                        uVar31 = lVar35 + 1;
                        if (lVar35 < -1) {
                          uVar41 = (long)uVar31 >> 4;
LAB_00115460:
                          pcVar18 = (&(args.
                                       super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Deque_impl_data._M_start._M_last)->
                                      _M_dataplus)[uVar41]._M_p + (uVar31 + uVar41 * -0x10) * 0x20;
                        }
                        else {
                          if (0xf < uVar31) {
                            uVar41 = uVar31 >> 4;
                            goto LAB_00115460;
                          }
                          pcVar18 = (char *)(args.
                                             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Deque_impl_data._M_map_size + 0x20);
                        }
                        iVar13 = std::__cxx11::string::compare(pcVar18);
                        if (iVar13 != 0) goto LAB_00115ebc;
                        lVar35 = (long)(args.
                                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Deque_impl_data._M_map_size -
                                       (long)args.
                                             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 5;
                        uVar31 = lVar35 + 3;
                        if (lVar35 < -3) {
                          uVar41 = (long)uVar31 >> 4;
LAB_001154cb:
                          pcVar18 = (&(args.
                                       super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Deque_impl_data._M_start._M_last)->
                                      _M_dataplus)[uVar41]._M_p + (uVar31 + uVar41 * -0x10) * 0x20;
                        }
                        else {
                          if (0xf < uVar31) {
                            uVar41 = uVar31 >> 4;
                            goto LAB_001154cb;
                          }
                          pcVar18 = (char *)(args.
                                             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Deque_impl_data._M_map_size + 0x60);
                        }
                        iVar13 = std::__cxx11::string::compare(pcVar18);
                        if (iVar13 != 0) {
LAB_00115ebc:
                          puVar16 = (undefined8 *)__cxa_allocate_exception(0x28);
                          puVar16[2] = 0;
                          puVar16[3] = 0;
                          puVar16[4] = 0;
                          puVar16[1] = puVar16 + 3;
                          *puVar16 = &PTR__NativeException_00242de8;
                          __cxa_throw(puVar16,&chatra::IllegalArgumentException::typeinfo,
                                      chatra::NativeException::~NativeException);
                        }
                        uVar31 = (long)(args.
                                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Deque_impl_data._M_map_size -
                                       (long)args.
                                             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 5;
                        if ((long)uVar31 < 0) {
                          uVar41 = (long)(args.
                                          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Deque_impl_data._M_map_size -
                                         (long)args.
                                               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 9
                          ;
LAB_00115525:
                          plVar17 = (long *)((&(args.
                                                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Deque_impl_data._M_start._M_last)->
                                               _M_dataplus)[uVar41]._M_p +
                                            (uVar31 + uVar41 * -0x10) * 0x20);
                        }
                        else {
                          plVar17 = (long *)args.
                                            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Deque_impl_data._M_map_size;
                          if (0xf < uVar31) {
                            uVar41 = uVar31 >> 4;
                            goto LAB_00115525;
                          }
                        }
                        local_168 = (undefined1  [8])&fileName._M_string_length;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)local_168,*plVar17,plVar17[1] + *plVar17);
                        pdVar34 = (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)(&packageName.field_2._M_allocated_capacity + 1);
                        std::
                        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::pop_front(pdVar34);
                        std::
                        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::pop_front(pdVar34);
                        local_58 = (undefined1  [8])&vName._M_string_length;
                        subLine.field_2._8_8_ = 0x19;
                        local_58 = (undefined1  [8])
                                   std::__cxx11::string::_M_create
                                             ((ulong *)local_58,(ulong)((long)&subLine.field_2 + 8))
                        ;
                        vName._M_string_length = subLine.field_2._8_8_;
                        builtin_strncpy((char *)local_58,"line number in code point",0x19);
                        vName._M_dataplus._M_p = (pointer)subLine.field_2._8_8_;
                        *(char *)((long)local_58 + subLine.field_2._8_8_) = '\0';
                        uVar42 = consume<unsigned_int,_nullptr>((string *)local_58,pdVar34);
                        local_178 = (long *)CONCAT44(local_178._4_4_,uVar42);
                        if (local_58 != (undefined1  [8])&vName._M_string_length) {
                          operator_delete((void *)local_58);
                        }
                        std::
                        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::pop_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)((long)&packageName.field_2 + 8));
                        (*(debugger.
                           super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->_vptr_IDebugger[10])((undefined1 *)((long)&subLine.field_2 + 8))
                        ;
                        pPVar8 = packages.
                                 super__Vector_base<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                        uVar22 = subLine.field_2._8_8_;
                        if ((pointer)subLine.field_2._8_8_ ==
                            packages.
                            super__Vector_base<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                            ._M_impl.super__Vector_impl_data._M_start) {
                          pIVar23 = (IllegalArgumentException *)__cxa_allocate_exception(0x28);
                          chatra::IllegalArgumentException::IllegalArgumentException
                                    (pIVar23,"no packages",__str.field_2._8_8_);
                          __cxa_throw(pIVar23,&chatra::IllegalArgumentException::typeinfo,
                                      chatra::NativeException::~NativeException);
                        }
                        do {
                          sortScripts((vector<chatra::Script,_std::allocator<chatra::Script>_> *)
                                      (((pointer)uVar22)->scripts).
                                      super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                          uVar22 = uVar22 + 0x40;
                        } while ((pointer)uVar22 != pPVar8);
                        packages.
                        super__Vector_base<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                        local_58 = (undefined1  [8])((long)&vName.field_2 + 0xf);
                        vName._M_dataplus._M_p = (pointer)(&__str.field_2._M_allocated_capacity + 1)
                        ;
                        vName._M_string_length =
                             (size_type)
                             &packages.
                              super__Vector_base<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage;
                        vName.field_2._M_allocated_capacity = (size_type)local_168;
                        local_170 = packages.
                                    super__Vector_base<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                        lVar35 = (long)packages.
                                       super__Vector_base<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                                       ._M_impl.super__Vector_impl_data._M_start -
                                 subLine.field_2._8_8_;
                        uVar22 = subLine.field_2._8_8_;
                        if (0 < lVar35 >> 8) {
                          lVar36 = (lVar35 >> 8) + 1;
                          do {
                            bVar12 = __gnu_cxx::__ops::
                                     _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
                                     ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                                                  *)local_58,
                                                  (
                                                  __normal_iterator<const_chatra::debugger::PackageState_*,_std::vector<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>_>
                                                  )uVar22);
                            __it._M_current = (PackageState *)uVar22;
                            if (bVar12) goto LAB_00115775;
                            bVar12 = __gnu_cxx::__ops::
                                     _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
                                     ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                                                  *)local_58,(PackageState *)(uVar22 + 0x40));
                            __it._M_current = (PackageState *)(uVar22 + 0x40);
                            if (bVar12) goto LAB_00115775;
                            bVar12 = __gnu_cxx::__ops::
                                     _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
                                     ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                                                  *)local_58,(PackageState *)(uVar22 + 0x80));
                            __it._M_current = (PackageState *)(uVar22 + 0x80);
                            if (bVar12) goto LAB_00115775;
                            bVar12 = __gnu_cxx::__ops::
                                     _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
                                     ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                                                  *)local_58,(PackageState *)(uVar22 + 0xc0));
                            __it._M_current = (PackageState *)(uVar22 + 0xc0);
                            if (bVar12) goto LAB_00115775;
                            uVar22 = uVar22 + 0x100;
                            lVar36 = lVar36 + -1;
                            lVar35 = lVar35 + -0x100;
                          } while (1 < lVar36);
                        }
                        lVar35 = lVar35 >> 6;
                        if (lVar35 == 1) {
LAB_0011574b:
                          bVar12 = __gnu_cxx::__ops::
                                   _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
                                   ::operator()((_Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                                                 *)local_58,
                                                (__normal_iterator<const_chatra::debugger::PackageState_*,_std::vector<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>_>
                                                 )uVar22);
                          __it._M_current = local_170;
                          if (bVar12) {
                            __it._M_current = (PackageState *)uVar22;
                          }
                        }
                        else if (lVar35 == 2) {
LAB_00115737:
                          bVar12 = __gnu_cxx::__ops::
                                   _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
                                   ::operator()((_Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                                                 *)local_58,
                                                (__normal_iterator<const_chatra::debugger::PackageState_*,_std::vector<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>_>
                                                 )uVar22);
                          __it._M_current = (PackageState *)uVar22;
                          if (!bVar12) {
                            uVar22 = uVar22 + 0x40;
                            goto LAB_0011574b;
                          }
                        }
                        else {
                          __it._M_current = local_170;
                          if ((lVar35 == 3) &&
                             (bVar12 = __gnu_cxx::__ops::
                                       _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
                                       ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                                                  *)local_58,
                                                  (
                                                  __normal_iterator<const_chatra::debugger::PackageState_*,_std::vector<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>_>
                                                  )uVar22), __it._M_current = (PackageState *)uVar22
                             , !bVar12)) {
                            uVar22 = uVar22 + 0x40;
                            goto LAB_00115737;
                          }
                        }
LAB_00115775:
                        pPVar8 = packages.
                                 super__Vector_base<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                        if (__it._M_current ==
                            packages.
                            super__Vector_base<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                            ._M_impl.super__Vector_impl_data._M_start) {
                          local_58 = (undefined1  [8])((long)&vName.field_2 + 0xf);
                          vName._M_dataplus._M_p =
                               (pointer)(&__str.field_2._M_allocated_capacity + 1);
                          vName._M_string_length =
                               (size_type)
                               &packages.
                                super__Vector_base<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage;
                          vName.field_2._M_allocated_capacity = (size_type)local_168;
                          local_170 = __it._M_current - subLine.field_2._8_8_;
                          uVar22 = subLine.field_2._8_8_;
                          if (0 < (long)local_170 >> 8) {
                            lVar35 = ((long)local_170 >> 8) + 1;
                            do {
                              bVar12 = __gnu_cxx::__ops::
                                       _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
                                       ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                                                  *)local_58,
                                                  (
                                                  __normal_iterator<const_chatra::debugger::PackageState_*,_std::vector<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>_>
                                                  )uVar22);
                              __it._M_current = (PackageState *)uVar22;
                              if (bVar12) goto LAB_001159a3;
                              bVar12 = __gnu_cxx::__ops::
                                       _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
                                       ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                                                  *)local_58,(PackageState *)(uVar22 + 0x40));
                              __it._M_current = (PackageState *)(uVar22 + 0x40);
                              if (bVar12) goto LAB_001159a3;
                              bVar12 = __gnu_cxx::__ops::
                                       _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
                                       ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                                                  *)local_58,(PackageState *)(uVar22 + 0x80));
                              __it._M_current = (PackageState *)(uVar22 + 0x80);
                              if (bVar12) goto LAB_001159a3;
                              bVar12 = __gnu_cxx::__ops::
                                       _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
                                       ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                                                  *)local_58,(PackageState *)(uVar22 + 0xc0));
                              __it._M_current = (PackageState *)(uVar22 + 0xc0);
                              if (bVar12) goto LAB_001159a3;
                              uVar22 = uVar22 + 0x100;
                              lVar35 = lVar35 + -1;
                              local_170 = local_170 + -4;
                            } while (1 < lVar35);
                          }
                          lVar35 = (long)local_170 >> 6;
                          if (lVar35 != 1) {
                            __it._M_current = (PackageState *)uVar22;
                            if (lVar35 != 2) {
                              __it._M_current = pPVar8;
                              if ((lVar35 != 3) ||
                                 (bVar12 = __gnu_cxx::__ops::
                                           _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
                                           ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                                                  *)local_58,
                                                  (
                                                  __normal_iterator<const_chatra::debugger::PackageState_*,_std::vector<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>_>
                                                  )uVar22), __it._M_current = (PackageState *)uVar22
                                 , bVar12)) goto LAB_001159a3;
                              __it._M_current = (PackageState *)(uVar22 + 0x40);
                            }
                            bVar12 = __gnu_cxx::__ops::
                                     _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
                                     ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                                                  *)local_58,__it);
                            if (bVar12) goto LAB_001159a3;
                            uVar22 = __it._M_current + 1;
                          }
                          bVar12 = __gnu_cxx::__ops::
                                   _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
                                   ::operator()((_Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                                                 *)local_58,
                                                (__normal_iterator<const_chatra::debugger::PackageState_*,_std::vector<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>_>
                                                 )uVar22);
                          __it._M_current = pPVar8;
                          if (bVar12) {
                            __it._M_current = (PackageState *)uVar22;
                          }
                        }
LAB_001159a3:
                        auVar38 = local_168;
                        if ((__it._M_current ==
                             packages.
                             super__Vector_base<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                             ._M_impl.super__Vector_impl_data._M_start) &&
                           ((vName.field_2._M_local_buf[0xf] & 1U) != 0)) {
                          piVar25 = __errno_location();
                          iVar13 = *piVar25;
                          *piVar25 = 0;
                          lVar35 = strtol((char *)auVar38,(char **)local_58,10);
                          pPVar8 = packages.
                                   super__Vector_base<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                          if (local_58 == auVar38) {
                            local_170 = __it._M_current;
                            std::__throw_invalid_argument("stoi");
                            if (nullErrorReceiver.super_IErrorReceiver._vptr_IErrorReceiver !=
                                (IErrorReceiver)&cmd._M_string_length) {
                              operator_delete((void *)nullErrorReceiver.super_IErrorReceiver.
                                                      _vptr_IErrorReceiver);
                            }
                            std::
                            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)((long)&packageName.field_2 + 8));
                            std::
                            vector<std::shared_ptr<chatra::Line>,_std::allocator<std::shared_ptr<chatra::Line>_>_>
                            ::~vector((vector<std::shared_ptr<chatra::Line>,_std::allocator<std::shared_ptr<chatra::Line>_>_>
                                       *)((long)&lines.field_2 + 8));
                            if (sTable.
                                super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr != (element_type *)0x0) {
                              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                         sTable.
                                         super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr);
                            }
                            if (local_268 != (string *)&input._M_string_length) {
                              operator_delete(local_268);
                            }
                            if (local_1c8 != &subLine._M_string_length) {
                              operator_delete(local_1c8);
                            }
                            if (local_208 != &line._M_string_length) {
                              operator_delete(local_208);
                            }
                            if (local_2d0 != &lines._M_string_length) {
                              operator_delete(local_2d0);
                            }
                            _Unwind_Resume(auVar38);
                          }
                          iVar14 = (int)lVar35;
                          if ((iVar14 != lVar35) || (*piVar25 == 0x22)) {
                            local_170 = __it._M_current;
                            std::__throw_out_of_range("stoi");
                          }
                          if (*piVar25 == 0) {
                            *piVar25 = iVar13;
                          }
                          local_17c = iVar14;
                          if (iVar14 != -1) {
                            local_58 = (undefined1  [8])((long)&__str.field_2 + 8);
                            vName._M_dataplus._M_p = (pointer)&local_17c;
                            vName._M_string_length =
                                 (size_type)
                                 &packages.
                                  super__Vector_base<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
                            lVar35 = (long)packages.
                                           super__Vector_base<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                                           ._M_impl.super__Vector_impl_data._M_start -
                                     subLine.field_2._8_8_;
                            uVar22 = subLine.field_2._8_8_;
                            if (0 < lVar35 >> 8) {
                              lVar36 = (lVar35 >> 8) + 1;
                              do {
                                bVar12 = __gnu_cxx::__ops::
                                         _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_2>
                                         ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__2>
                                                  *)local_58,
                                                  (
                                                  __normal_iterator<const_chatra::debugger::PackageState_*,_std::vector<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>_>
                                                  )uVar22);
                                __it._M_current = (PackageState *)uVar22;
                                if (bVar12) goto LAB_00115bde;
                                bVar12 = __gnu_cxx::__ops::
                                         _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_2>
                                         ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__2>
                                                  *)local_58,(PackageState *)(uVar22 + 0x40));
                                __it._M_current = (PackageState *)(uVar22 + 0x40);
                                if (bVar12) goto LAB_00115bde;
                                bVar12 = __gnu_cxx::__ops::
                                         _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_2>
                                         ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__2>
                                                  *)local_58,(PackageState *)(uVar22 + 0x80));
                                __it._M_current = (PackageState *)(uVar22 + 0x80);
                                if (bVar12) goto LAB_00115bde;
                                bVar12 = __gnu_cxx::__ops::
                                         _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_2>
                                         ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__2>
                                                  *)local_58,(PackageState *)(uVar22 + 0xc0));
                                __it._M_current = (PackageState *)(uVar22 + 0xc0);
                                if (bVar12) goto LAB_00115bde;
                                uVar22 = uVar22 + 0x100;
                                lVar36 = lVar36 + -1;
                                lVar35 = lVar35 + -0x100;
                              } while (1 < lVar36);
                            }
                            lVar35 = lVar35 >> 6;
                            if (lVar35 != 1) {
                              __it._M_current = (PackageState *)uVar22;
                              if (lVar35 != 2) {
                                __it._M_current = pPVar8;
                                if ((lVar35 != 3) ||
                                   (bVar12 = __gnu_cxx::__ops::
                                             _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_2>
                                             ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__2>
                                                  *)local_58,
                                                  (
                                                  __normal_iterator<const_chatra::debugger::PackageState_*,_std::vector<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>_>
                                                  )uVar22), __it._M_current = (PackageState *)uVar22
                                   , bVar12)) goto LAB_00115bde;
                                __it._M_current = (PackageState *)(uVar22 + 0x40);
                              }
                              bVar12 = __gnu_cxx::__ops::
                                       _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_2>
                                       ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__2>
                                                  *)local_58,__it);
                              if (bVar12) goto LAB_00115bde;
                              uVar22 = __it._M_current + 1;
                            }
                            bVar12 = __gnu_cxx::__ops::
                                     _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_2>
                                     ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__2>
                                                  *)local_58,
                                                  (
                                                  __normal_iterator<const_chatra::debugger::PackageState_*,_std::vector<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>_>
                                                  )uVar22);
                            __it._M_current = pPVar8;
                            if (bVar12) {
                              __it._M_current = (PackageState *)uVar22;
                            }
                          }
                        }
LAB_00115bde:
                        if (__it._M_current ==
                            packages.
                            super__Vector_base<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                            ._M_impl.super__Vector_impl_data._M_start) {
                          pIVar23 = (IllegalArgumentException *)__cxa_allocate_exception(0x28);
                          chatra::IllegalArgumentException::IllegalArgumentException
                                    (pIVar23,"file \"%s:%s\" is not found",__str.field_2._8_8_,
                                     local_168);
                          __cxa_throw(pIVar23,&chatra::IllegalArgumentException::typeinfo,
                                      chatra::NativeException::~NativeException);
                        }
                        local_a8 = (undefined1  [8])&verb._M_string_length;
                        verb._M_dataplus._M_p = (pointer)0x0;
                        verb._M_string_length = verb._M_string_length & 0xffffffffffffff00;
                        verb.field_2._8_8_ = &local_78;
                        local_78._M_allocated_capacity =
                             local_78._M_allocated_capacity & 0xffffffffffffff00;
                        std::__cxx11::string::_M_assign((string *)local_a8);
                        std::__cxx11::string::_M_assign((string *)(verb.field_2._M_local_buf + 8));
                        local_68 = (uint)local_178;
                        std::
                        vector<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                        ::~vector((vector<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                                   *)((long)&subLine.field_2 + 8));
                        if (local_168 != (undefined1  [8])&fileName._M_string_length) {
                          operator_delete((void *)local_168);
                        }
                        if ((size_type *)__str.field_2._8_8_ != &packageName._M_string_length) {
                          operator_delete((void *)__str.field_2._8_8_);
                        }
                        iVar13 = (*(debugger.
                                    super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_IDebugger[8])
                                           (debugger.
                                            super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr,local_a8);
                        do {
                          SVar7.flag.super___atomic_flag_base._M_i =
                               lockBreak.flag.super___atomic_flag_base._M_i;
                          LOCK();
                          lockBreak.flag.super___atomic_flag_base._M_i =
                               (atomic_flag)(__atomic_flag_base)0x1;
                          UNLOCK();
                        } while ((__atomic_flag_base)SVar7.flag.super___atomic_flag_base._M_i !=
                                 false);
                        std::vector<BreakPointState,_std::allocator<BreakPointState>_>::
                        emplace_back<>(&breakPoints);
                        pBVar6 = breakPoints.
                                 super__Vector_base<BreakPointState,_std::allocator<BreakPointState>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                        breakPoints.
                        super__Vector_base<BreakPointState,_std::allocator<BreakPointState>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1].breakPointId =
                             CONCAT44(extraout_var_02,iVar13);
                        std::__cxx11::string::operator=
                                  ((string *)&pBVar6[-1].codePoint,(string *)local_a8);
                        std::__cxx11::string::operator=
                                  ((string *)&pBVar6[-1].codePoint.fileName,
                                   (string *)(verb.field_2._M_local_buf + 8));
                        pBVar6[-1].codePoint.lineNo = local_68;
                        lockBreak.flag.super___atomic_flag_base._M_i =
                             (atomic_flag)(__atomic_flag_base)0x0;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)verb.field_2._8_8_ != &local_78) {
                          operator_delete((void *)verb.field_2._8_8_);
                        }
                      }
                      else {
                        iVar13 = std::__cxx11::string::compare((char *)&nullErrorReceiver);
                        if (iVar13 == 0) {
                          local_a8 = (undefined1  [8])&verb._M_string_length;
                          verb._M_dataplus._M_p = (pointer)0x3;
                          verb._M_string_length = CONCAT44(verb._M_string_length._4_4_,0x6c6564);
                          consume<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                                    (&local_380,(string *)local_a8,
                                     (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)((long)&packageName.field_2 + 8));
                          parseTargetId((string *)local_360);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_380._M_dataplus._M_p != &local_380.field_2) {
                            operator_delete(local_380._M_dataplus._M_p);
                          }
                          auVar38 = local_360;
                          if ((int)e.super__Tuple_impl<0UL,_Target,_unsigned_long>.
                                   super__Tuple_impl<1UL,_unsigned_long>.
                                   super__Head_base<1UL,_unsigned_long,_false>._M_head_impl != 6) {
                            pIVar23 = (IllegalArgumentException *)__cxa_allocate_exception(0x28);
                            chatra::IllegalArgumentException::IllegalArgumentException
                                      (pIVar23,"required %s-ID","breakpoint");
                            __cxa_throw(pIVar23,&chatra::IllegalArgumentException::typeinfo,
                                        chatra::NativeException::~NativeException);
                          }
                          if (local_a8 != (undefined1  [8])&verb._M_string_length) {
                            operator_delete((void *)local_a8);
                          }
                          do {
                            SVar7.flag.super___atomic_flag_base._M_i =
                                 lockBreak.flag.super___atomic_flag_base._M_i;
                            LOCK();
                            lockBreak.flag.super___atomic_flag_base._M_i =
                                 (atomic_flag)(__atomic_flag_base)0x1;
                            UNLOCK();
                          } while ((__atomic_flag_base)SVar7.flag.super___atomic_flag_base._M_i !=
                                   false);
                          lVar36 = (long)breakPoints.
                                         super__Vector_base<BreakPointState,_std::allocator<BreakPointState>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)breakPoints.
                                         super__Vector_base<BreakPointState,_std::allocator<BreakPointState>_>
                                         ._M_impl.super__Vector_impl_data._M_start;
                          lVar35 = (lVar36 >> 4) * -0x3333333333333333 >> 2;
                          __position._M_current =
                               breakPoints.
                               super__Vector_base<BreakPointState,_std::allocator<BreakPointState>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                          if (0 < lVar35) {
                            lVar36 = lVar35 + 1;
                            __position._M_current =
                                 breakPoints.
                                 super__Vector_base<BreakPointState,_std::allocator<BreakPointState>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 2;
                            do {
                              if ((undefined1  [8])__position._M_current[-2].breakPointId == auVar38
                                 ) {
                                __position._M_current = __position._M_current + -2;
                                goto LAB_00115df5;
                              }
                              if ((undefined1  [8])__position._M_current[-1].breakPointId == auVar38
                                 ) {
                                __position._M_current = __position._M_current + -1;
                                goto LAB_00115df5;
                              }
                              if ((undefined1  [8])(__position._M_current)->breakPointId == auVar38)
                              goto LAB_00115df5;
                              if ((undefined1  [8])__position._M_current[1].breakPointId == auVar38)
                              {
                                __position._M_current = __position._M_current + 1;
                                goto LAB_00115df5;
                              }
                              lVar36 = lVar36 + -1;
                              __position._M_current = __position._M_current + 4;
                            } while (1 < lVar36);
                            lVar36 = (long)breakPoints.
                                           super__Vector_base<BreakPointState,_std::allocator<BreakPointState>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(breakPoints.
                                            super__Vector_base<BreakPointState,_std::allocator<BreakPointState>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar35 * 4);
                            __position._M_current =
                                 breakPoints.
                                 super__Vector_base<BreakPointState,_std::allocator<BreakPointState>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar35 * 4;
                          }
                          lVar35 = (lVar36 >> 4) * -0x3333333333333333;
                          if (lVar35 == 1) {
LAB_0011596d:
                            if ((undefined1  [8])(__position._M_current)->breakPointId != auVar38) {
                              __position._M_current =
                                   breakPoints.
                                   super__Vector_base<BreakPointState,_std::allocator<BreakPointState>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                            }
                          }
                          else if (lVar35 == 2) {
LAB_00115964:
                            if ((undefined1  [8])(__position._M_current)->breakPointId != auVar38) {
                              __position._M_current = __position._M_current + 1;
                              goto LAB_0011596d;
                            }
                          }
                          else {
                            if (lVar35 != 3) {
LAB_00115fff:
                              pIVar23 = (IllegalArgumentException *)__cxa_allocate_exception(0x28);
                              chatra::IllegalArgumentException::IllegalArgumentException
                                        (pIVar23,"breakpoint B%zu is not found",auVar38);
                              __cxa_throw(pIVar23,&chatra::IllegalArgumentException::typeinfo,
                                          chatra::NativeException::~NativeException);
                            }
                            if ((undefined1  [8])(__position._M_current)->breakPointId != auVar38) {
                              __position._M_current = __position._M_current + 1;
                              goto LAB_00115964;
                            }
                          }
LAB_00115df5:
                          if (__position._M_current !=
                              breakPoints.
                              super__Vector_base<BreakPointState,_std::allocator<BreakPointState>_>.
                              _M_impl.super__Vector_impl_data._M_finish) {
                            (*(debugger.
                               super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->_vptr_IDebugger[9])
                                      (debugger.
                                       super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,auVar38);
                            std::vector<BreakPointState,_std::allocator<BreakPointState>_>::_M_erase
                                      (&breakPoints,__position);
                            lockBreak.flag.super___atomic_flag_base._M_i =
                                 (atomic_flag)(__atomic_flag_base)0x0;
                            goto LAB_00114ab0;
                          }
                          goto LAB_00115fff;
                        }
                        iVar13 = std::__cxx11::string::compare((char *)&nullErrorReceiver);
                        if (iVar13 != 0) {
                          iVar13 = std::__cxx11::string::compare((char *)&nullErrorReceiver);
                          if (iVar13 == 0) {
                            psVar32 = &verb._M_string_length;
                            verb._M_string_length = 0x746e692070657473;
                            verb._M_dataplus._M_p = (pointer)0x9;
                            verb.field_2._M_allocated_capacity._0_2_ = 0x6f;
                            local_a8 = (undefined1  [8])psVar32;
                            TVar26 = consumeTargetId<chatra::debugger::ThreadId,(Target)2>
                                               ((string *)psVar32,
                                                packageName.field_2._M_local_buf + 8,args_00);
                            if (local_a8 != (undefined1  [8])psVar32) {
                              operator_delete((void *)local_a8);
                            }
                            LOCK();
                            interruptionState._M_i = Acceptable;
                            UNLOCK();
                            SVar15 = (*(debugger.
                                        super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->_vptr_IDebugger[6])
                                               (debugger.
                                                super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr,TVar26);
                            showStepRunResult(TVar26,SVar15);
                          }
                          else {
                            iVar13 = std::__cxx11::string::compare((char *)&nullErrorReceiver);
                            if (iVar13 == 0) {
                              psVar32 = &verb._M_string_length;
                              verb._M_string_length = 0x65766f2070657473;
                              verb._M_dataplus._M_p = (pointer)0x9;
                              verb.field_2._M_allocated_capacity._0_2_ = 0x72;
                              local_a8 = (undefined1  [8])psVar32;
                              TVar26 = consumeTargetId<chatra::debugger::ThreadId,(Target)2>
                                                 ((string *)psVar32,
                                                  packageName.field_2._M_local_buf + 8,args_01);
                              if (local_a8 != (undefined1  [8])psVar32) {
                                operator_delete((void *)local_a8);
                              }
                              LOCK();
                              interruptionState._M_i = Acceptable;
                              UNLOCK();
                              SVar15 = (*(debugger.
                                          super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->_vptr_IDebugger[5])
                                                 (debugger.
                                                  super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr,TVar26);
                              showStepRunResult(TVar26,SVar15);
                            }
                            else {
                              iVar13 = std::__cxx11::string::compare((char *)&nullErrorReceiver);
                              if (iVar13 != 0) {
                                iVar13 = std::__cxx11::string::compare((char *)&nullErrorReceiver);
                                if (iVar13 != 0) {
                                  std::
                                  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::push_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                *)((long)&packageName.field_2 + 8),
                                               (value_type *)&nullErrorReceiver);
                                  std::
                                  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::_Deque_base((_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 *)local_a8,
                                                (_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 *)((long)&packageName.field_2 + 8));
                                  show((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_a8);
                                  goto LAB_00114bac;
                                }
                                psVar32 = &verb._M_string_length;
                                verb._M_dataplus._M_p = (pointer)0x4;
                                verb._M_string_length =
                                     CONCAT35(verb._M_string_length._5_3_,0x6c6c696b);
                                local_a8 = (undefined1  [8])psVar32;
                                TVar26 = consumeTargetId<chatra::debugger::ThreadId,(Target)2>
                                                   ((string *)psVar32,
                                                    packageName.field_2._M_local_buf + 8,args_03);
                                if (local_a8 != (undefined1  [8])psVar32) {
                                  operator_delete((void *)local_a8);
                                }
                                (*(debugger.
                                   super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->_vptr_IDebugger[0x10])
                                          (debugger.
                                           super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr,TVar26);
                                goto LAB_00114ab0;
                              }
                              psVar32 = &verb._M_string_length;
                              verb._M_string_length = 0x74756f2070657473;
                              verb._M_dataplus._M_p = (pointer)0x8;
                              verb.field_2._M_allocated_capacity =
                                   verb.field_2._M_allocated_capacity & 0xffffffffffffff00;
                              local_a8 = (undefined1  [8])psVar32;
                              TVar26 = consumeTargetId<chatra::debugger::ThreadId,(Target)2>
                                                 ((string *)psVar32,
                                                  packageName.field_2._M_local_buf + 8,args_02);
                              if (local_a8 != (undefined1  [8])psVar32) {
                                operator_delete((void *)local_a8);
                              }
                              LOCK();
                              interruptionState._M_i = Acceptable;
                              UNLOCK();
                              SVar15 = (*(debugger.
                                          super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->_vptr_IDebugger[7])
                                                 (debugger.
                                                  super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr,TVar26);
                              showStepRunResult(TVar26,SVar15);
                            }
                          }
                          goto LAB_00114bc9;
                        }
                        psVar32 = &vName._M_string_length;
                        vName._M_dataplus._M_p = (pointer)0x4;
                        vName._M_string_length = CONCAT35(vName._M_string_length._5_3_,0x70657473);
                        local_58 = (undefined1  [8])psVar32;
                        consume<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_a8,(string *)psVar32,
                                   (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)((long)&packageName.field_2 + 8));
                        pdVar34 = extraout_RDX;
                        if (local_58 != (undefined1  [8])psVar32) {
                          operator_delete((void *)local_58);
                          pdVar34 = extraout_RDX_00;
                        }
                        psVar32 = &vName._M_string_length;
                        vName._M_dataplus._M_p = (pointer)0x4;
                        vName._M_string_length = CONCAT35(vName._M_string_length._5_3_,0x70657473);
                        local_58 = (undefined1  [8])psVar32;
                        TVar26 = consumeTargetId<chatra::debugger::ThreadId,(Target)2>
                                           ((string *)psVar32,packageName.field_2._M_local_buf + 8,
                                            pdVar34);
                        if (local_58 != (undefined1  [8])psVar32) {
                          operator_delete((void *)local_58);
                        }
                        LOCK();
                        interruptionState._M_i = Acceptable;
                        UNLOCK();
                        iVar13 = std::__cxx11::string::compare(local_a8);
                        lVar35 = 0x30;
                        if ((iVar13 != 0) &&
                           (iVar13 = std::__cxx11::string::compare(local_a8), iVar13 != 0)) {
                          iVar13 = std::__cxx11::string::compare(local_a8);
                          if (iVar13 == 0) {
                            lVar35 = 0x28;
                          }
                          else {
                            iVar13 = std::__cxx11::string::compare(local_a8);
                            lVar35 = 0x38;
                            if (iVar13 != 0) {
                              pIVar23 = (IllegalArgumentException *)__cxa_allocate_exception(0x28);
                              chatra::IllegalArgumentException::IllegalArgumentException
                                        (pIVar23,"unknown command: \"step %s\"",local_a8);
                              __cxa_throw(pIVar23,&chatra::IllegalArgumentException::typeinfo,
                                          chatra::NativeException::~NativeException);
                            }
                          }
                        }
                        SVar15 = (**(code **)((long)(debugger.
                                                  super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->_vptr_IDebugger + lVar35))
                                           (debugger.
                                            super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr,TVar26);
                        showStepRunResult(TVar26,SVar15);
                        LOCK();
                        interruptionState._M_i = Masked;
                        UNLOCK();
                      }
                      psVar4 = &verb;
                      auVar38 = local_a8;
                      goto LAB_00114f53;
                    }
                    if (args.
                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node ==
                        (_Map_pointer)
                        args.
                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_map_size) {
                      dLog(0,"package  instance  thread  frame  scope  object  breakpoint");
                    }
                    else {
                      std::
                      _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::_Deque_base((_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_a8,
                                    (_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)((long)&packageName.field_2 + 8));
                      show((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_a8);
LAB_00114bac:
                      std::
                      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_a8);
                    }
                  }
                }
LAB_00114ab0:
                if (nullErrorReceiver.super_IErrorReceiver._vptr_IErrorReceiver !=
                    (IErrorReceiver)&cmd._M_string_length) {
                  operator_delete((void *)nullErrorReceiver.super_IErrorReceiver.
                                          _vptr_IErrorReceiver);
                }
                std::
                deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)((long)&packageName.field_2 + 8));
              }
              else {
                dError("syntax error (type \"!h\" to show help)");
              }
              std::
              vector<std::shared_ptr<chatra::Line>,_std::allocator<std::shared_ptr<chatra::Line>_>_>
              ::~vector((vector<std::shared_ptr<chatra::Line>,_std::allocator<std::shared_ptr<chatra::Line>_>_>
                         *)((long)&lines.field_2 + 8));
              if (sTable.super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  != (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           sTable.
                           super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
              }
            }
            else {
              sVar21 = findToken(local_268,(size_t)input._M_dataplus._M_p);
              if (sVar21 != 0) {
                pcVar18 = packageName.field_2._M_local_buf + 8;
                std::__cxx11::string::substr((ulong)pcVar18,(ulong)&local_268);
                iVar13 = std::__cxx11::string::compare(pcVar18);
                if ((iVar13 == 0) || (iVar13 = std::__cxx11::string::compare(pcVar18), iVar13 == 0))
                {
                  dError("warning: %s block on top-level was ignored since it has no effect in interactive mode."
                         ,packageName.field_2._8_8_);
                  if ((size_t *)packageName.field_2._8_8_ != psVar40) {
                    operator_delete((void *)packageName.field_2._8_8_);
                  }
                  goto LAB_00114a06;
                }
                if ((size_t *)packageName.field_2._8_8_ != psVar40) {
                  operator_delete((void *)packageName.field_2._8_8_);
                }
              }
              cVar11 = '\x01';
              if (9 < __val) {
                cVar10 = '\x04';
                uVar42 = __val;
                do {
                  cVar11 = cVar10;
                  if (uVar42 < 100) {
                    cVar11 = cVar11 + -2;
                    goto LAB_001146b4;
                  }
                  if (uVar42 < 1000) {
                    cVar11 = cVar11 + -1;
                    goto LAB_001146b4;
                  }
                  if (uVar42 < 10000) goto LAB_001146b4;
                  bVar12 = 99999 < uVar42;
                  cVar10 = cVar11 + '\x04';
                  uVar42 = uVar42 / 10000;
                } while (bVar12);
                cVar11 = cVar11 + '\x01';
              }
LAB_001146b4:
              local_58 = (undefined1  [8])&vName._M_string_length;
              std::__cxx11::string::_M_construct((ulong)local_58,cVar11);
              std::__detail::__to_chars_10_impl<unsigned_int>
                        ((char *)local_58,(uint)vName._M_dataplus._M_p,__val);
              plVar17 = (long *)std::__cxx11::string::replace
                                          ((ulong)local_58,0,(char *)0x0,0x1ce5a4);
              psVar28 = (size_t *)(plVar17 + 2);
              if ((size_t *)*plVar17 == psVar28) {
                args.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_map_size = *psVar28;
                args.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)plVar17[3];
                packageName.field_2._8_8_ = psVar40;
              }
              else {
                args.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_map_size = *psVar28;
                packageName.field_2._8_8_ = (size_t *)*plVar17;
              }
              args.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)plVar17[1];
              *plVar17 = (long)psVar28;
              plVar17[1] = 0;
              *(undefined1 *)(plVar17 + 2) = 0;
              puVar16 = (undefined8 *)
                        std::__cxx11::string::append(packageName.field_2._M_local_buf + 8);
              local_a8 = (undefined1  [8])&verb._M_string_length;
              psVar32 = puVar16 + 2;
              if ((size_type *)*puVar16 == psVar32) {
                verb._M_string_length = *psVar32;
                verb.field_2._M_allocated_capacity = puVar16[3];
              }
              else {
                verb._M_string_length = *psVar32;
                local_a8 = (undefined1  [8])*puVar16;
              }
              verb._M_dataplus._M_p = (pointer)puVar16[1];
              *puVar16 = psVar32;
              puVar16[1] = 0;
              *(undefined1 *)(puVar16 + 2) = 0;
              if ((size_t *)packageName.field_2._8_8_ != psVar40) {
                operator_delete((void *)packageName.field_2._8_8_);
              }
              if (local_58 != (undefined1  [8])&vName._M_string_length) {
                operator_delete((void *)local_58);
              }
              this_00 = host.super___shared_ptr<Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_58 = (undefined1  [8])&vName._M_string_length;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"");
              local_228 = &local_218;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_228,local_a8,verb._M_dataplus._M_p + (long)local_a8);
              line.field_2._8_8_ = &local_1d8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)((long)&line.field_2 + 8),local_268,
                         input._M_dataplus._M_p + (long)local_268);
              if (local_228 == &local_218) {
                args.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur = pbStack_210;
                packageName.field_2._8_8_ = psVar40;
              }
              else {
                packageName.field_2._8_8_ = local_228;
              }
              args.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_map_size = CONCAT71(uStack_217,local_218);
              args.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_first =
                   (_Elt_pointer)
                   &args.
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_node;
              args.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_map = local_220;
              local_220 = (_Map_pointer)0x0;
              local_218 = 0;
              if ((undefined1 *)line.field_2._8_8_ == &local_1d8) {
                args.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur = pbStack_1d0;
              }
              else {
                args.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)line.field_2._8_8_
                ;
              }
              args.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node =
                   (_Map_pointer)CONCAT71(uStack_1d7,local_1d8);
              args.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_last = local_1e0;
              local_1e0 = (_Elt_pointer)0x0;
              local_1d8 = 0;
              this = (vector<chatra::Script,_std::allocator<chatra::Script>_> *)
                     (&__str.field_2._M_allocated_capacity + 1);
              __l._M_len = 1;
              __l._M_array = (iterator)((long)&packageName.field_2 + 8);
              local_228 = &local_218;
              line.field_2._8_8_ = &local_1d8;
              std::vector<chatra::Script,_std::allocator<chatra::Script>_>::vector
                        (this,__l,(allocator_type *)local_168);
              Host::push(this_00,(string *)local_58,this);
              std::vector<chatra::Script,_std::allocator<chatra::Script>_>::~vector(this);
              if (args.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_first !=
                  (_Elt_pointer)
                  &args.
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node) {
                operator_delete(args.
                                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_first);
              }
              if ((size_t *)packageName.field_2._8_8_ != psVar40) {
                operator_delete((void *)packageName.field_2._8_8_);
              }
              if ((undefined1 *)line.field_2._8_8_ != &local_1d8) {
                operator_delete((void *)line.field_2._8_8_);
              }
              if (local_228 != &local_218) {
                operator_delete(local_228);
              }
              if (local_58 != (undefined1  [8])&vName._M_string_length) {
                operator_delete((void *)local_58);
              }
              (*(runtime.super___shared_ptr<chatra::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_Runtime[0xc])
                        (runtime.super___shared_ptr<chatra::Runtime,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,interactiveInstanceId,local_a8,&local_268);
              if (local_a8 != (undefined1  [8])&verb._M_string_length) {
                operator_delete((void *)local_a8);
              }
              LOCK();
              interruptionState._M_i = Acceptable;
              UNLOCK();
              runUntilBreak();
              LOCK();
              interruptionState._M_i = Masked;
              UNLOCK();
              __val = __val + 1;
            }
          }
        }
LAB_00114a06:
        if (local_268 != (string *)&input._M_string_length) {
          operator_delete(local_268);
        }
        uVar42 = 1;
        local_178 = (long *)((ulong)local_178 & 0xffffffff00000000);
      }
      else {
        if (line._M_dataplus._M_p < (pointer)0x2) goto LAB_00113a52;
LAB_00113d15:
        line._M_dataplus._M_p = (pointer)0x0;
        *(char *)local_208 = '\0';
        local_178 = (long *)CONCAT44(local_178._4_4_,(int)CONCAT71((int7)((ulong)local_208 >> 8),1))
        ;
      }
      bVar12 = false;
    }
    else {
      std::__cxx11::string::substr((ulong)local_a8,(ulong)&local_1c8);
      plVar17 = (long *)std::__cxx11::string::_M_replace_aux
                                  ((ulong)local_a8,(ulong)verb._M_dataplus._M_p,0,'\x01');
      psVar28 = (size_t *)(plVar17 + 2);
      if ((size_t *)*plVar17 == psVar28) {
        args.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_map_size = *psVar28;
        args.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)plVar17[3];
        packageName.field_2._8_8_ = psVar40;
      }
      else {
        args.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_map_size = *psVar28;
        packageName.field_2._8_8_ = (size_t *)*plVar17;
      }
      args.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)plVar17[1];
      *plVar17 = (long)psVar28;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_208,packageName.field_2._8_8_);
      if ((size_t *)packageName.field_2._8_8_ != psVar40) {
        operator_delete((void *)packageName.field_2._8_8_);
      }
      if (local_a8 != (undefined1  [8])&verb._M_string_length) {
        operator_delete((void *)local_a8);
      }
      bVar12 = true;
    }
    if (local_1c8 != &subLine._M_string_length) {
      operator_delete(local_1c8);
    }
  } while( true );
}

Assistant:

[[noreturn]] static void interactiveMode() {
	std::signal(SIGINT, signalHandler);

	rl_bind_key('\t', rl_insert);
	stifle_history(1000);

	interactiveInstanceId = runtime->createInteractiveInstance();

	dLog(0, "Chatra interactive frontend");
	dLog(0, "type \"!h\" to show debugger command help");

	unsigned sectionNo = 0;
	unsigned lineNo = 1;
	std::string lines;
	std::string line;
	bool lineContinuation = false;
	bool blockContinuation = false;

	for (;;) {
		auto buffer = readline(prompt(blockContinuation, lineContinuation, sectionNo, lineNo));
		auto length = std::strlen(buffer);
		lineNo++;

		unsigned lineIndent = 0;
		for (size_t i = 0; i < length; i++) {
			if (buffer[i] == '\t')
				lineIndent++;
			else if (i + 3 < length && buffer[i] == ' ' && buffer[i + 1] == ' ' && buffer[i + 2] == ' ' && buffer[i + 3] == ' ') {
				lineIndent++;
				i += 3;
			}
		}

		auto subLine = std::string(buffer, length);

		if (lineContinuation) {
			for (unsigned i = 0; i < lineIndent + 2; i++)
				subLine.insert(subLine.cbegin(), '\t');
		}

		if (subLine.cend() != std::find_if(subLine.cbegin(), subLine.cend(), [](char c) {
				return cha::isNotSpace(c) && c != '\n';  })) {
			add_history(const_cast<char*>(subLine.data()));
		}

		if (subLine.empty() || subLine.back() != '\n')  // may be always true
			subLine += '\n';

		if (subLine.size() >= 2 && subLine[subLine.size() - 2] == '\\') {
			lineContinuation = true;
			line += subLine.substr(0, subLine.size() - 2) + '\n';
			continue;
		}
		else {
			lineContinuation = false;
			line += subLine;
		}

		// Remove line continuation marker when it comes from history and
		// contains wrapped line
		for (;;) {
			auto pos = line.find("\\\n");
			if (pos == std::string::npos)
				break;
			line.erase(pos, 1);
		}

		lines += line;
		if (blockContinuation) {
			if (line.size() <= 1)
				blockContinuation = false;
			else {
				line.clear();
				continue;
			}
		}
		else {
			auto it = std::find_if(line.cbegin(), line.cend(), cha::isNotSpace);
			if (isBlockStatement(std::string(it, line.cend()))) {
				blockContinuation = true;
				line.clear();
				continue;
			}
		}
		line.clear();
		auto input = lines.substr(std::distance(lines.cbegin(), std::find_if(lines.cbegin(), lines.cend(), cha::isNotSpace)));
		lines.clear();
		lineNo = 1;

		if (input.cend() == std::find_if(input.cbegin(), input.cend(), [](char c) {
				return cha::isNotSpace(c) && c != '\n';  })) {
			continue;
		}

		if (input[0] == '!') {
			processDebuggerCommand(input);
			continue;
		}

		auto t0Length = findToken(input);
		if (t0Length != 0) {
			auto firstToken = input.substr(0, t0Length);
			if (firstToken == "catch" || firstToken == "finally") {
				dError("warning: %s block on top-level was ignored since it has no effect in interactive mode.",
						firstToken.data());
				continue;
			}
		}

		try {
			auto scriptName = "chatra[" + std::to_string(sectionNo++) + "]";
			host->push("", {{scriptName, input}});
			runtime->push(interactiveInstanceId, scriptName, input);
		}
		catch (const cha::NativeException& ex) {
			dError("interactive mode: %s", ex.what() == nullptr ? "error" : ex.what());
			continue;
		}

		interruptible([&]() {
			runUntilBreak();
		});
	}
}